

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNiIntersectorK<8,16>::
intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
          (CurveNiIntersectorK<8,16> *this,Precalculations *pre,RayHitK<16> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Vector *pVVar5;
  float fVar6;
  uint *puVar7;
  code *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  ulong uVar87;
  byte bVar88;
  long lVar89;
  byte bVar90;
  int iVar91;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  bool bVar92;
  undefined1 uVar93;
  undefined1 uVar94;
  ulong uVar95;
  uint uVar96;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  uint uVar161;
  uint uVar162;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  uint uVar163;
  uint uVar167;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar160 [32];
  float pp;
  float fVar168;
  undefined4 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  undefined1 auVar182 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar185;
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar251 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [32];
  undefined1 auVar252 [16];
  undefined1 auVar254 [32];
  undefined1 auVar257 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [64];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 *local_ad0;
  undefined8 local_ac8;
  undefined8 local_ac0;
  Precalculations *local_ab8;
  int *local_ab0;
  undefined4 local_aa8;
  undefined1 local_aa0 [32];
  undefined1 (*local_a80) [32];
  RayQueryContext *local_a78;
  ulong local_a70;
  ulong local_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [64];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [64];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar82 = *(byte *)((long)&context->scene + 1);
  uVar86 = (ulong)bVar82;
  fVar6 = *(float *)((long)context + uVar86 * 0x19 + 0x12);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar99 = vinsertps_avx(auVar99,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x20);
  auVar22 = vinsertps_avx(ZEXT416((uint)pre->ray_space[4].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[5].vy.field_0.m128[(long)ray]),0x10);
  auVar105 = vinsertps_avx(auVar22,ZEXT416((uint)pre->ray_space[6].vz.field_0.m128[(long)ray]),0x20)
  ;
  auVar106 = vsubps_avx(auVar99,*(undefined1 (*) [16])((long)context + uVar86 * 0x19 + 6));
  fVar226 = fVar6 * auVar106._0_4_;
  fVar168 = fVar6 * auVar105._0_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar99);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar22);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar97);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar100);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0xc + 6);
  auVar119 = vpmovsxbd_avx2(auVar101);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0xd + 6);
  auVar120 = vpmovsxbd_avx2(auVar103);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0x12 + 6);
  auVar121 = vpmovsxbd_avx2(auVar102);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0x13 + 6);
  auVar124 = vpmovsxbd_avx2(auVar98);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)((long)&context->scene + uVar86 * 0x14 + 6);
  auVar113 = vpmovsxbd_avx2(auVar104);
  auVar122 = vcvtdq2ps_avx(auVar124);
  auVar123 = vcvtdq2ps_avx(auVar113);
  auVar132._4_4_ = fVar168;
  auVar132._0_4_ = fVar168;
  auVar132._8_4_ = fVar168;
  auVar132._12_4_ = fVar168;
  auVar132._16_4_ = fVar168;
  auVar132._20_4_ = fVar168;
  auVar132._24_4_ = fVar168;
  auVar132._28_4_ = fVar168;
  auVar134._8_4_ = 1;
  auVar134._0_8_ = 0x100000001;
  auVar134._12_4_ = 1;
  auVar134._16_4_ = 1;
  auVar134._20_4_ = 1;
  auVar134._24_4_ = 1;
  auVar134._28_4_ = 1;
  auVar125 = ZEXT1632(CONCAT412(fVar6 * auVar105._12_4_,
                                CONCAT48(fVar6 * auVar105._8_4_,
                                         CONCAT44(fVar6 * auVar105._4_4_,fVar168))));
  auVar114 = vpermps_avx2(auVar134,auVar125);
  auVar111 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar112 = vpermps_avx512vl(auVar111,auVar125);
  fVar168 = auVar112._0_4_;
  fVar183 = auVar112._4_4_;
  auVar125._4_4_ = fVar183 * auVar116._4_4_;
  auVar125._0_4_ = fVar168 * auVar116._0_4_;
  fVar185 = auVar112._8_4_;
  auVar125._8_4_ = fVar185 * auVar116._8_4_;
  fVar197 = auVar112._12_4_;
  auVar125._12_4_ = fVar197 * auVar116._12_4_;
  fVar199 = auVar112._16_4_;
  auVar125._16_4_ = fVar199 * auVar116._16_4_;
  fVar201 = auVar112._20_4_;
  auVar125._20_4_ = fVar201 * auVar116._20_4_;
  fVar184 = auVar112._24_4_;
  auVar125._24_4_ = fVar184 * auVar116._24_4_;
  auVar125._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar120._4_4_ * fVar183;
  auVar113._0_4_ = auVar120._0_4_ * fVar168;
  auVar113._8_4_ = auVar120._8_4_ * fVar185;
  auVar113._12_4_ = auVar120._12_4_ * fVar197;
  auVar113._16_4_ = auVar120._16_4_ * fVar199;
  auVar113._20_4_ = auVar120._20_4_ * fVar201;
  auVar113._24_4_ = auVar120._24_4_ * fVar184;
  auVar113._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar123._4_4_ * fVar183;
  auVar124._0_4_ = auVar123._0_4_ * fVar168;
  auVar124._8_4_ = auVar123._8_4_ * fVar185;
  auVar124._12_4_ = auVar123._12_4_ * fVar197;
  auVar124._16_4_ = auVar123._16_4_ * fVar199;
  auVar124._20_4_ = auVar123._20_4_ * fVar201;
  auVar124._24_4_ = auVar123._24_4_ * fVar184;
  auVar124._28_4_ = auVar112._28_4_;
  auVar99 = vfmadd231ps_fma(auVar125,auVar114,auVar115);
  auVar22 = vfmadd231ps_fma(auVar113,auVar114,auVar119);
  auVar97 = vfmadd231ps_fma(auVar124,auVar122,auVar114);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar132,auVar117);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar132,auVar118);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar121,auVar132);
  auVar133._4_4_ = fVar226;
  auVar133._0_4_ = fVar226;
  auVar133._8_4_ = fVar226;
  auVar133._12_4_ = fVar226;
  auVar133._16_4_ = fVar226;
  auVar133._20_4_ = fVar226;
  auVar133._24_4_ = fVar226;
  auVar133._28_4_ = fVar226;
  auVar113 = ZEXT1632(CONCAT412(fVar6 * auVar106._12_4_,
                                CONCAT48(fVar6 * auVar106._8_4_,
                                         CONCAT44(fVar6 * auVar106._4_4_,fVar226))));
  auVar124 = vpermps_avx2(auVar134,auVar113);
  auVar113 = vpermps_avx512vl(auVar111,auVar113);
  auVar274 = ZEXT3264(auVar113);
  auVar114 = vmulps_avx512vl(auVar113,auVar116);
  auVar127._0_4_ = auVar113._0_4_ * auVar120._0_4_;
  auVar127._4_4_ = auVar113._4_4_ * auVar120._4_4_;
  auVar127._8_4_ = auVar113._8_4_ * auVar120._8_4_;
  auVar127._12_4_ = auVar113._12_4_ * auVar120._12_4_;
  auVar127._16_4_ = auVar113._16_4_ * auVar120._16_4_;
  auVar127._20_4_ = auVar113._20_4_ * auVar120._20_4_;
  auVar127._24_4_ = auVar113._24_4_ * auVar120._24_4_;
  auVar127._28_4_ = 0;
  auVar120._4_4_ = auVar113._4_4_ * auVar123._4_4_;
  auVar120._0_4_ = auVar113._0_4_ * auVar123._0_4_;
  auVar120._8_4_ = auVar113._8_4_ * auVar123._8_4_;
  auVar120._12_4_ = auVar113._12_4_ * auVar123._12_4_;
  auVar120._16_4_ = auVar113._16_4_ * auVar123._16_4_;
  auVar120._20_4_ = auVar113._20_4_ * auVar123._20_4_;
  auVar120._24_4_ = auVar113._24_4_ * auVar123._24_4_;
  auVar120._28_4_ = auVar116._28_4_;
  auVar115 = vfmadd231ps_avx512vl(auVar114,auVar124,auVar115);
  auVar100 = vfmadd231ps_fma(auVar127,auVar124,auVar119);
  auVar101 = vfmadd231ps_fma(auVar120,auVar124,auVar122);
  auVar115 = vfmadd231ps_avx512vl(auVar115,auVar133,auVar117);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar133,auVar118);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar133,auVar121);
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  auVar117 = vandps_avx(auVar131,ZEXT1632(auVar99));
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar129._16_4_ = 0x219392ef;
  auVar129._20_4_ = 0x219392ef;
  auVar129._24_4_ = 0x219392ef;
  auVar129._28_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar117,auVar129,1);
  bVar92 = (bool)((byte)uVar87 & 1);
  auVar114._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar99._0_4_;
  bVar92 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar99._4_4_;
  bVar92 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar99._8_4_;
  bVar92 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar99._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(auVar131,ZEXT1632(auVar22));
  uVar87 = vcmpps_avx512vl(auVar117,auVar129,1);
  bVar92 = (bool)((byte)uVar87 & 1);
  auVar111._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar22._0_4_;
  bVar92 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar22._4_4_;
  bVar92 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar22._8_4_;
  bVar92 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar22._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(auVar131,ZEXT1632(auVar97));
  uVar87 = vcmpps_avx512vl(auVar117,auVar129,1);
  bVar92 = (bool)((byte)uVar87 & 1);
  auVar117._0_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar97._0_4_;
  bVar92 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar97._4_4_;
  bVar92 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar97._8_4_;
  bVar92 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar92 * 0x219392ef | (uint)!bVar92 * auVar97._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar114);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = 0x3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar130._16_4_ = 0x3f800000;
  auVar130._20_4_ = 0x3f800000;
  auVar130._24_4_ = 0x3f800000;
  auVar130._28_4_ = 0x3f800000;
  auVar99 = vfnmadd213ps_fma(auVar114,auVar116,auVar130);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar111);
  auVar22 = vfnmadd213ps_fma(auVar111,auVar116,auVar130);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar117);
  auVar97 = vfnmadd213ps_fma(auVar117,auVar116,auVar130);
  auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar116,auVar116);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar86 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx512vl(auVar117,auVar115);
  auVar121._4_4_ = auVar99._4_4_ * auVar117._4_4_;
  auVar121._0_4_ = auVar99._0_4_ * auVar117._0_4_;
  auVar121._8_4_ = auVar99._8_4_ * auVar117._8_4_;
  auVar121._12_4_ = auVar99._12_4_ * auVar117._12_4_;
  auVar121._16_4_ = auVar117._16_4_ * 0.0;
  auVar121._20_4_ = auVar117._20_4_ * 0.0;
  auVar121._24_4_ = auVar117._24_4_ * 0.0;
  auVar121._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar86 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx512vl(auVar117,auVar115);
  auVar128._0_4_ = auVar99._0_4_ * auVar117._0_4_;
  auVar128._4_4_ = auVar99._4_4_ * auVar117._4_4_;
  auVar128._8_4_ = auVar99._8_4_ * auVar117._8_4_;
  auVar128._12_4_ = auVar99._12_4_ * auVar117._12_4_;
  auVar128._16_4_ = auVar117._16_4_ * 0.0;
  auVar128._20_4_ = auVar117._20_4_ * 0.0;
  auVar128._24_4_ = auVar117._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar86 * 0xe + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar100));
  auVar122._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar122._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar122._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar122._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar122._16_4_ = auVar117._16_4_ * 0.0;
  auVar122._20_4_ = auVar117._20_4_ * 0.0;
  auVar122._24_4_ = auVar117._24_4_ * 0.0;
  auVar122._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar82 * 0x10 + 6)
                           );
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar100));
  auVar126._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar126._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar126._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar126._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar126._16_4_ = auVar117._16_4_ * 0.0;
  auVar126._20_4_ = auVar117._20_4_ * 0.0;
  auVar126._24_4_ = auVar117._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar86 * 0x15 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar101));
  auVar123._4_4_ = auVar117._4_4_ * auVar97._4_4_;
  auVar123._0_4_ = auVar117._0_4_ * auVar97._0_4_;
  auVar123._8_4_ = auVar117._8_4_ * auVar97._8_4_;
  auVar123._12_4_ = auVar117._12_4_ * auVar97._12_4_;
  auVar123._16_4_ = auVar117._16_4_ * 0.0;
  auVar123._20_4_ = auVar117._20_4_ * 0.0;
  auVar123._24_4_ = auVar117._24_4_ * 0.0;
  auVar123._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar86 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar101));
  auVar112._0_4_ = auVar97._0_4_ * auVar117._0_4_;
  auVar112._4_4_ = auVar97._4_4_ * auVar117._4_4_;
  auVar112._8_4_ = auVar97._8_4_ * auVar117._8_4_;
  auVar112._12_4_ = auVar97._12_4_ * auVar117._12_4_;
  auVar112._16_4_ = auVar117._16_4_ * 0.0;
  auVar112._20_4_ = auVar117._20_4_ * 0.0;
  auVar112._24_4_ = auVar117._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar117 = vpminsd_avx2(auVar121,auVar128);
  auVar115 = vpminsd_avx2(auVar122,auVar126);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115 = vpminsd_avx2(auVar123,auVar112);
  uVar169 = *(undefined4 *)((long)&pre->ray_space[2].vz.field_0 + (long)ray * 4);
  auVar116._4_4_ = uVar169;
  auVar116._0_4_ = uVar169;
  auVar116._8_4_ = uVar169;
  auVar116._12_4_ = uVar169;
  auVar116._16_4_ = uVar169;
  auVar116._20_4_ = uVar169;
  auVar116._24_4_ = uVar169;
  auVar116._28_4_ = uVar169;
  auVar115 = vmaxps_avx512vl(auVar115,auVar116);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115._8_4_ = 0x3f7ffffa;
  auVar115._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar115._12_4_ = 0x3f7ffffa;
  auVar115._16_4_ = 0x3f7ffffa;
  auVar115._20_4_ = 0x3f7ffffa;
  auVar115._24_4_ = 0x3f7ffffa;
  auVar115._28_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar117,auVar115);
  auVar117 = vpmaxsd_avx2(auVar121,auVar128);
  auVar115 = vpmaxsd_avx2(auVar122,auVar126);
  auVar258 = ZEXT3264(auVar131);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar115 = vpmaxsd_avx2(auVar123,auVar112);
  uVar169 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
  auVar118._4_4_ = uVar169;
  auVar118._0_4_ = uVar169;
  auVar118._8_4_ = uVar169;
  auVar118._12_4_ = uVar169;
  auVar118._16_4_ = uVar169;
  auVar118._20_4_ = uVar169;
  auVar118._24_4_ = uVar169;
  auVar118._28_4_ = uVar169;
  auVar115 = vminps_avx512vl(auVar115,auVar118);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar119._8_4_ = 0x3f800003;
  auVar119._0_8_ = 0x3f8000033f800003;
  auVar119._12_4_ = 0x3f800003;
  auVar119._16_4_ = 0x3f800003;
  auVar119._20_4_ = 0x3f800003;
  auVar119._24_4_ = 0x3f800003;
  auVar119._28_4_ = 0x3f800003;
  auVar117 = vmulps_avx512vl(auVar117,auVar119);
  auVar115 = vpbroadcastd_avx512vl();
  uVar23 = vcmpps_avx512vl(local_5c0,auVar117,2);
  uVar26 = vpcmpgtd_avx512vl(auVar115,_DAT_01fb4ba0);
  local_a70 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar26));
  local_a80 = (undefined1 (*) [32])local_240;
  auVar182 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar182);
  local_a78 = context;
LAB_01a13948:
  iVar91 = 1;
  if (local_a70 == 0) {
    return;
  }
  lVar89 = 0;
  for (uVar87 = local_a70; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    lVar89 = lVar89 + 1;
  }
  fVar168 = *(float *)((long)&context->scene + 2);
  uVar86 = (ulong)(uint)fVar168;
  local_a68 = (ulong)*(uint *)((long)&context->scene + lVar89 * 4 + 6);
  lVar89 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar86 * 8);
  uVar87 = (ulong)*(uint *)(*(long *)(lVar89 + 0x58) + local_a68 * *(long *)(lVar89 + 0x68));
  auVar99 = *(undefined1 (*) [16])(*(long *)(lVar89 + 0x90) + *(long *)(lVar89 + 0xa0) * uVar87);
  auVar22 = *(undefined1 (*) [16])
             (*(long *)(lVar89 + 0x90) + *(long *)(lVar89 + 0xa0) * (uVar87 + 1));
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar100 = vinsertps_avx(auVar97,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x28)
  ;
  local_980 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[4].vx.field_0.m128[(long)ray]));
  auVar275 = ZEXT3264(local_980);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[5].vy.field_0.m128[(long)ray]));
  auVar97 = vunpcklps_avx512vl(local_980._0_16_,local_640._0_16_);
  local_9a0 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[6].vz.field_0.m128[(long)ray]));
  auVar276 = ZEXT3264(local_9a0);
  auVar104 = local_9a0._0_16_;
  local_9b0 = vinsertps_avx512f(auVar97,auVar104,0x28);
  auVar106._8_4_ = 0xbeaaaaab;
  auVar106._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar106._12_4_ = 0xbeaaaaab;
  auVar103 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               (*(long *)(lVar89 + 0x100) + uVar87 * *(long *)(lVar89 + 0x110)),
                              auVar99,auVar106);
  auVar101 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (*(long *)(lVar89 + 0x100) + *(long *)(lVar89 + 0x110) * (uVar87 + 1))
                             ,auVar22,auVar106);
  auVar109._0_4_ = auVar22._0_4_ + auVar99._0_4_ + auVar103._0_4_ + auVar101._0_4_;
  auVar109._4_4_ = auVar22._4_4_ + auVar99._4_4_ + auVar103._4_4_ + auVar101._4_4_;
  auVar109._8_4_ = auVar22._8_4_ + auVar99._8_4_ + auVar103._8_4_ + auVar101._8_4_;
  auVar109._12_4_ = auVar22._12_4_ + auVar99._12_4_ + auVar103._12_4_ + auVar101._12_4_;
  auVar105._8_4_ = 0x3e800000;
  auVar105._0_8_ = 0x3e8000003e800000;
  auVar105._12_4_ = 0x3e800000;
  auVar97 = vmulps_avx512vl(auVar109,auVar105);
  auVar97 = vsubps_avx(auVar97,auVar100);
  auVar97 = vdpps_avx(auVar97,local_9b0,0x7f);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  fVar6 = pre->ray_space[2].vz.field_0.m128[(long)ray];
  auVar108._4_12_ = ZEXT812(0) << 0x20;
  auVar108._0_4_ = local_9c0._0_4_;
  auVar98 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar108);
  auVar102 = vfnmadd213ss_fma(auVar98,local_9c0,ZEXT416(0x40000000));
  local_5a0 = auVar97._0_4_ * auVar98._0_4_ * auVar102._0_4_;
  auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar278 = ZEXT3264(auVar117);
  auVar107._4_4_ = local_5a0;
  auVar107._0_4_ = local_5a0;
  auVar107._8_4_ = local_5a0;
  auVar107._12_4_ = local_5a0;
  fStack_950 = local_5a0;
  _local_960 = auVar107;
  fStack_94c = local_5a0;
  fStack_948 = local_5a0;
  fStack_944 = local_5a0;
  auVar97 = vfmadd231ps_fma(auVar100,local_9b0,auVar107);
  auVar97 = vblendps_avx(auVar97,ZEXT816(0) << 0x40,8);
  auVar99 = vsubps_avx(auVar99,auVar97);
  auVar100 = vsubps_avx(auVar101,auVar97);
  auVar101 = vsubps_avx(auVar103,auVar97);
  auVar22 = vsubps_avx(auVar22,auVar97);
  uVar169 = auVar99._0_4_;
  local_a40._4_4_ = uVar169;
  local_a40._0_4_ = uVar169;
  local_a40._8_4_ = uVar169;
  local_a40._12_4_ = uVar169;
  local_a40._16_4_ = uVar169;
  local_a40._20_4_ = uVar169;
  local_a40._24_4_ = uVar169;
  local_a40._28_4_ = uVar169;
  auVar266 = ZEXT3264(local_a40);
  auVar135._8_4_ = 1;
  auVar135._0_8_ = 0x100000001;
  auVar135._12_4_ = 1;
  auVar135._16_4_ = 1;
  auVar135._20_4_ = 1;
  auVar135._24_4_ = 1;
  auVar135._28_4_ = 1;
  local_800 = ZEXT1632(auVar99);
  local_a60 = vpermps_avx2(auVar135,local_800);
  auVar267 = ZEXT3264(local_a60);
  auVar136._8_4_ = 2;
  auVar136._0_8_ = 0x200000002;
  auVar136._12_4_ = 2;
  auVar136._16_4_ = 2;
  auVar136._20_4_ = 2;
  auVar136._24_4_ = 2;
  auVar136._28_4_ = 2;
  local_a00 = vpermps_avx2(auVar136,local_800);
  auVar137._8_4_ = 3;
  auVar137._0_8_ = 0x300000003;
  auVar137._12_4_ = 3;
  auVar137._16_4_ = 3;
  auVar137._20_4_ = 3;
  auVar137._24_4_ = 3;
  auVar137._28_4_ = 3;
  local_a20 = vpermps_avx2(auVar137,local_800);
  fVar183 = auVar101._0_4_;
  auVar271._4_4_ = fVar183;
  auVar271._0_4_ = fVar183;
  auVar271._8_4_ = fVar183;
  auVar271._12_4_ = fVar183;
  auVar271._16_4_ = fVar183;
  auVar271._20_4_ = fVar183;
  auVar271._24_4_ = fVar183;
  auVar271._28_4_ = fVar183;
  local_840 = ZEXT1632(auVar101);
  auVar117 = vpermps_avx512vl(auVar135,local_840);
  auVar115 = vpermps_avx512vl(auVar136,local_840);
  auVar116 = vpermps_avx512vl(auVar137,local_840);
  auVar118 = vbroadcastss_avx512vl(auVar100);
  local_820 = ZEXT1632(auVar100);
  auVar119 = vpermps_avx512vl(auVar135,local_820);
  auVar120 = vpermps_avx512vl(auVar136,local_820);
  auVar121 = vpermps_avx512vl(auVar137,local_820);
  auVar122 = vbroadcastss_avx512vl(auVar22);
  _local_860 = ZEXT1632(auVar22);
  auVar123 = vpermps_avx512vl(auVar135,_local_860);
  auVar124 = vpermps_avx512vl(auVar136,_local_860);
  auVar113 = vpermps_avx512vl(auVar137,_local_860);
  auVar263 = ZEXT3264(local_a00);
  auVar99 = vmulss_avx512f(auVar104,auVar104);
  auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),local_640,local_640);
  auVar114 = vfmadd231ps_avx512vl(auVar114,local_980,local_980);
  uVar169 = auVar114._0_4_;
  local_560._4_4_ = uVar169;
  local_560._0_4_ = uVar169;
  local_560._8_4_ = uVar169;
  local_560._12_4_ = uVar169;
  local_560._16_4_ = uVar169;
  local_560._20_4_ = uVar169;
  local_560._24_4_ = uVar169;
  local_560._28_4_ = uVar169;
  local_580 = vandps_avx(auVar258._0_32_,local_560);
  auVar265 = ZEXT3264(local_a20);
  local_910 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar6 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar182 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar182);
  uVar87 = 0;
  auVar182 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar182);
  auVar99 = vsqrtss_avx(local_9c0,local_9c0);
  auVar22 = vsqrtss_avx(local_9c0,local_9c0);
  local_670 = ZEXT816(0x3f80000000000000);
  do {
    auVar97 = vmovshdup_avx(local_670);
    auVar97 = vsubps_avx(auVar97,local_670);
    fVar185 = auVar97._0_4_;
    fVar184 = fVar185 * 0.04761905;
    auVar241._0_4_ = local_670._0_4_;
    auVar241._4_4_ = auVar241._0_4_;
    auVar241._8_4_ = auVar241._0_4_;
    auVar241._12_4_ = auVar241._0_4_;
    auVar241._16_4_ = auVar241._0_4_;
    auVar241._20_4_ = auVar241._0_4_;
    auVar241._24_4_ = auVar241._0_4_;
    auVar241._28_4_ = auVar241._0_4_;
    auVar247._4_4_ = fVar185;
    auVar247._0_4_ = fVar185;
    auVar247._8_4_ = fVar185;
    auVar247._12_4_ = fVar185;
    auVar247._16_4_ = fVar185;
    auVar247._20_4_ = fVar185;
    auVar247._24_4_ = fVar185;
    auVar247._28_4_ = fVar185;
    auVar97 = vfmadd231ps_fma(auVar241,auVar247,_DAT_01f7b040);
    auVar277 = auVar278._0_32_;
    auVar114 = vsubps_avx512vl(auVar277,ZEXT1632(auVar97));
    fVar185 = auVar97._0_4_;
    fVar197 = auVar97._4_4_;
    auVar147._4_4_ = fVar183 * fVar197;
    auVar147._0_4_ = fVar183 * fVar185;
    fVar199 = auVar97._8_4_;
    auVar147._8_4_ = fVar183 * fVar199;
    fVar201 = auVar97._12_4_;
    auVar147._12_4_ = fVar183 * fVar201;
    auVar147._16_4_ = fVar183 * 0.0;
    auVar147._20_4_ = fVar183 * 0.0;
    auVar147._24_4_ = fVar183 * 0.0;
    auVar147._28_4_ = DAT_01f7b040._28_4_;
    auVar126 = ZEXT1632(auVar97);
    auVar125 = vmulps_avx512vl(auVar117,auVar126);
    auVar111 = vmulps_avx512vl(auVar115,auVar126);
    auVar112 = vmulps_avx512vl(auVar116,auVar126);
    auVar100 = vfmadd231ps_fma(auVar147,auVar114,auVar266._0_32_);
    auVar101 = vfmadd231ps_fma(auVar125,auVar114,auVar267._0_32_);
    auVar103 = vfmadd231ps_fma(auVar111,auVar114,auVar263._0_32_);
    auVar102 = vfmadd231ps_fma(auVar112,auVar114,auVar265._0_32_);
    auVar125 = vmulps_avx512vl(auVar118,auVar126);
    auVar130 = ZEXT1632(auVar97);
    auVar111 = vmulps_avx512vl(auVar119,auVar130);
    auVar112 = vmulps_avx512vl(auVar120,auVar130);
    auVar126 = vmulps_avx512vl(auVar121,auVar130);
    auVar98 = vfmadd231ps_fma(auVar125,auVar114,auVar271);
    auVar125 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar117);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar115);
    auVar112 = vfmadd231ps_avx512vl(auVar126,auVar114,auVar116);
    auVar126 = vmulps_avx512vl(auVar122,auVar130);
    auVar127 = vmulps_avx512vl(auVar123,auVar130);
    auVar128 = vmulps_avx512vl(auVar124,auVar130);
    auVar129 = vmulps_avx512vl(auVar113,auVar130);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar114,auVar118);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar114,auVar119);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar114,auVar120);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar114,auVar121);
    auVar182._28_36_ = auVar274._28_36_;
    auVar182._0_28_ =
         ZEXT1628(CONCAT412(fVar201 * auVar98._12_4_,
                            CONCAT48(fVar199 * auVar98._8_4_,
                                     CONCAT44(fVar197 * auVar98._4_4_,fVar185 * auVar98._0_4_))));
    auVar130 = vmulps_avx512vl(auVar130,auVar125);
    auVar131 = vmulps_avx512vl(ZEXT1632(auVar97),auVar111);
    auVar132 = vmulps_avx512vl(ZEXT1632(auVar97),auVar112);
    auVar97 = vfmadd231ps_fma(auVar182._0_32_,auVar114,ZEXT1632(auVar100));
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar114,ZEXT1632(auVar101));
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar114,ZEXT1632(auVar103));
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar114,ZEXT1632(auVar102));
    auVar257._0_4_ = auVar126._0_4_ * fVar185;
    auVar257._4_4_ = auVar126._4_4_ * fVar197;
    auVar257._8_4_ = auVar126._8_4_ * fVar199;
    auVar257._12_4_ = auVar126._12_4_ * fVar201;
    auVar257._16_4_ = auVar126._16_4_ * 0.0;
    auVar257._20_4_ = auVar126._20_4_ * 0.0;
    auVar257._24_4_ = auVar126._24_4_ * 0.0;
    auVar257._28_4_ = 0;
    auVar143._4_4_ = auVar127._4_4_ * fVar197;
    auVar143._0_4_ = auVar127._0_4_ * fVar185;
    auVar143._8_4_ = auVar127._8_4_ * fVar199;
    auVar143._12_4_ = auVar127._12_4_ * fVar201;
    auVar143._16_4_ = auVar127._16_4_ * 0.0;
    auVar143._20_4_ = auVar127._20_4_ * 0.0;
    auVar143._24_4_ = auVar127._24_4_ * 0.0;
    auVar143._28_4_ = auVar126._28_4_;
    auVar144._4_4_ = auVar128._4_4_ * fVar197;
    auVar144._0_4_ = auVar128._0_4_ * fVar185;
    auVar144._8_4_ = auVar128._8_4_ * fVar199;
    auVar144._12_4_ = auVar128._12_4_ * fVar201;
    auVar144._16_4_ = auVar128._16_4_ * 0.0;
    auVar144._20_4_ = auVar128._20_4_ * 0.0;
    auVar144._24_4_ = auVar128._24_4_ * 0.0;
    auVar144._28_4_ = auVar127._28_4_;
    auVar248._4_4_ = auVar129._4_4_ * fVar197;
    auVar248._0_4_ = auVar129._0_4_ * fVar185;
    auVar248._8_4_ = auVar129._8_4_ * fVar199;
    auVar248._12_4_ = auVar129._12_4_ * fVar201;
    auVar248._16_4_ = auVar129._16_4_ * 0.0;
    auVar248._20_4_ = auVar129._20_4_ * 0.0;
    auVar248._24_4_ = auVar129._24_4_ * 0.0;
    auVar248._28_4_ = auVar128._28_4_;
    auVar100 = vfmadd231ps_fma(auVar257,auVar114,ZEXT1632(auVar98));
    auVar101 = vfmadd231ps_fma(auVar143,auVar114,auVar125);
    auVar103 = vfmadd231ps_fma(auVar144,auVar114,auVar111);
    auVar102 = vfmadd231ps_fma(auVar248,auVar114,auVar112);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar201 * auVar100._12_4_,
                                                 CONCAT48(fVar199 * auVar100._8_4_,
                                                          CONCAT44(fVar197 * auVar100._4_4_,
                                                                   fVar185 * auVar100._0_4_)))),
                              auVar114,ZEXT1632(auVar97));
    auVar127 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar101._12_4_ * fVar201,
                                             CONCAT48(auVar101._8_4_ * fVar199,
                                                      CONCAT44(auVar101._4_4_ * fVar197,
                                                               auVar101._0_4_ * fVar185)))),auVar114
                          ,auVar130);
    auVar128 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar103._12_4_ * fVar201,
                                             CONCAT48(auVar103._8_4_ * fVar199,
                                                      CONCAT44(auVar103._4_4_ * fVar197,
                                                               auVar103._0_4_ * fVar185)))),auVar114
                          ,auVar131);
    auVar125 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar102._12_4_ * fVar201,
                                             CONCAT48(auVar102._8_4_ * fVar199,
                                                      CONCAT44(auVar102._4_4_ * fVar197,
                                                               auVar102._0_4_ * fVar185)))),auVar132
                          ,auVar114);
    auVar114 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar97));
    auVar111 = vsubps_avx512vl(ZEXT1632(auVar101),auVar130);
    auVar112 = vsubps_avx512vl(ZEXT1632(auVar103),auVar131);
    auVar126 = vsubps_avx512vl(ZEXT1632(auVar102),auVar132);
    auVar268._0_4_ = fVar184 * auVar114._0_4_ * 3.0;
    auVar268._4_4_ = fVar184 * auVar114._4_4_ * 3.0;
    auVar268._8_4_ = fVar184 * auVar114._8_4_ * 3.0;
    auVar268._12_4_ = fVar184 * auVar114._12_4_ * 3.0;
    auVar268._16_4_ = fVar184 * auVar114._16_4_ * 3.0;
    auVar268._20_4_ = fVar184 * auVar114._20_4_ * 3.0;
    auVar268._24_4_ = fVar184 * auVar114._24_4_ * 3.0;
    auVar268._28_4_ = 0;
    auVar270._0_4_ = fVar184 * auVar111._0_4_ * 3.0;
    auVar270._4_4_ = fVar184 * auVar111._4_4_ * 3.0;
    auVar270._8_4_ = fVar184 * auVar111._8_4_ * 3.0;
    auVar270._12_4_ = fVar184 * auVar111._12_4_ * 3.0;
    auVar270._16_4_ = fVar184 * auVar111._16_4_ * 3.0;
    auVar270._20_4_ = fVar184 * auVar111._20_4_ * 3.0;
    auVar270._24_4_ = fVar184 * auVar111._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    auVar150._4_4_ = fVar184 * auVar112._4_4_ * 3.0;
    auVar150._0_4_ = fVar184 * auVar112._0_4_ * 3.0;
    auVar150._8_4_ = fVar184 * auVar112._8_4_ * 3.0;
    auVar150._12_4_ = fVar184 * auVar112._12_4_ * 3.0;
    auVar150._16_4_ = fVar184 * auVar112._16_4_ * 3.0;
    auVar150._20_4_ = fVar184 * auVar112._20_4_ * 3.0;
    auVar150._24_4_ = fVar184 * auVar112._24_4_ * 3.0;
    auVar150._28_4_ = auVar129._28_4_;
    fVar185 = auVar126._0_4_ * 3.0 * fVar184;
    fVar197 = auVar126._4_4_ * 3.0 * fVar184;
    auVar145._4_4_ = fVar197;
    auVar145._0_4_ = fVar185;
    fVar199 = auVar126._8_4_ * 3.0 * fVar184;
    auVar145._8_4_ = fVar199;
    fVar201 = auVar126._12_4_ * 3.0 * fVar184;
    auVar145._12_4_ = fVar201;
    fVar226 = auVar126._16_4_ * 3.0 * fVar184;
    auVar145._16_4_ = fVar226;
    fVar204 = auVar126._20_4_ * 3.0 * fVar184;
    auVar145._20_4_ = fVar204;
    fVar206 = auVar126._24_4_ * 3.0 * fVar184;
    auVar145._24_4_ = fVar206;
    auVar145._28_4_ = fVar184;
    auVar97 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
    auVar129 = vpermt2ps_avx512vl(ZEXT1632(auVar98),_DAT_01fb9fc0,ZEXT1632(auVar97));
    auVar130 = vpermt2ps_avx512vl(auVar127,_DAT_01fb9fc0,ZEXT1632(auVar97));
    auVar111 = ZEXT1632(auVar97);
    auVar131 = vpermt2ps_avx512vl(auVar128,_DAT_01fb9fc0,auVar111);
    auVar151._0_4_ = auVar125._0_4_ + fVar185;
    auVar151._4_4_ = auVar125._4_4_ + fVar197;
    auVar151._8_4_ = auVar125._8_4_ + fVar199;
    auVar151._12_4_ = auVar125._12_4_ + fVar201;
    auVar151._16_4_ = auVar125._16_4_ + fVar226;
    auVar151._20_4_ = auVar125._20_4_ + fVar204;
    auVar151._24_4_ = auVar125._24_4_ + fVar206;
    auVar151._28_4_ = auVar125._28_4_ + fVar184;
    auVar114 = vmaxps_avx(auVar125,auVar151);
    auVar132 = vminps_avx512vl(auVar125,auVar151);
    auVar133 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar111);
    auVar134 = vpermt2ps_avx512vl(auVar268,_DAT_01fb9fc0,auVar111);
    auVar135 = vpermt2ps_avx512vl(auVar270,_DAT_01fb9fc0,auVar111);
    auVar147 = ZEXT1632(auVar97);
    auVar136 = vpermt2ps_avx512vl(auVar150,_DAT_01fb9fc0,auVar147);
    auVar125 = vpermt2ps_avx512vl(auVar145,_DAT_01fb9fc0,auVar147);
    auVar125 = vsubps_avx(auVar133,auVar125);
    auVar111 = vsubps_avx(auVar129,ZEXT1632(auVar98));
    auVar112 = vsubps_avx(auVar130,auVar127);
    auVar126 = vsubps_avx(auVar131,auVar128);
    auVar137 = vmulps_avx512vl(auVar112,auVar150);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar270,auVar126);
    auVar138 = vmulps_avx512vl(auVar126,auVar268);
    auVar138 = vfmsub231ps_avx512vl(auVar138,auVar150,auVar111);
    auVar139 = vmulps_avx512vl(auVar111,auVar270);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar268,auVar112);
    auVar139 = vmulps_avx512vl(auVar139,auVar139);
    auVar138 = vfmadd231ps_avx512vl(auVar139,auVar138,auVar138);
    auVar137 = vfmadd231ps_avx512vl(auVar138,auVar137,auVar137);
    auVar138 = vmulps_avx512vl(auVar126,auVar126);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar112,auVar112);
    auVar140 = vfmadd231ps_avx512vl(auVar138,auVar111,auVar111);
    auVar138 = vrcp14ps_avx512vl(auVar140);
    auVar139 = vfnmadd213ps_avx512vl(auVar138,auVar140,auVar277);
    auVar138 = vfmadd132ps_avx512vl(auVar139,auVar138,auVar138);
    auVar137 = vmulps_avx512vl(auVar137,auVar138);
    auVar139 = vmulps_avx512vl(auVar112,auVar136);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar135,auVar126);
    auVar141 = vmulps_avx512vl(auVar126,auVar134);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar136,auVar111);
    auVar142 = vmulps_avx512vl(auVar111,auVar135);
    auVar142 = vfmsub231ps_avx512vl(auVar142,auVar134,auVar112);
    auVar142 = vmulps_avx512vl(auVar142,auVar142);
    auVar141 = vfmadd231ps_avx512vl(auVar142,auVar141,auVar141);
    auVar139 = vfmadd231ps_avx512vl(auVar141,auVar139,auVar139);
    auVar138 = vmulps_avx512vl(auVar139,auVar138);
    auVar137 = vmaxps_avx512vl(auVar137,auVar138);
    auVar137 = vsqrtps_avx512vl(auVar137);
    auVar138 = vmaxps_avx512vl(auVar125,auVar133);
    auVar114 = vmaxps_avx512vl(auVar114,auVar138);
    auVar142 = vaddps_avx512vl(auVar137,auVar114);
    auVar114 = vminps_avx(auVar125,auVar133);
    auVar114 = vminps_avx512vl(auVar132,auVar114);
    auVar114 = vsubps_avx512vl(auVar114,auVar137);
    auVar138._8_4_ = 0x3f800002;
    auVar138._0_8_ = 0x3f8000023f800002;
    auVar138._12_4_ = 0x3f800002;
    auVar138._16_4_ = 0x3f800002;
    auVar138._20_4_ = 0x3f800002;
    auVar138._24_4_ = 0x3f800002;
    auVar138._28_4_ = 0x3f800002;
    auVar125 = vmulps_avx512vl(auVar142,auVar138);
    auVar139._8_4_ = 0x3f7ffffc;
    auVar139._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar139._12_4_ = 0x3f7ffffc;
    auVar139._16_4_ = 0x3f7ffffc;
    auVar139._20_4_ = 0x3f7ffffc;
    auVar139._24_4_ = 0x3f7ffffc;
    auVar139._28_4_ = 0x3f7ffffc;
    local_aa0 = vmulps_avx512vl(auVar114,auVar139);
    auVar114 = vmulps_avx512vl(auVar125,auVar125);
    auVar125 = vrsqrt14ps_avx512vl(auVar140);
    auVar141._8_4_ = 0xbf000000;
    auVar141._0_8_ = 0xbf000000bf000000;
    auVar141._12_4_ = 0xbf000000;
    auVar141._16_4_ = 0xbf000000;
    auVar141._20_4_ = 0xbf000000;
    auVar141._24_4_ = 0xbf000000;
    auVar141._28_4_ = 0xbf000000;
    auVar132 = vmulps_avx512vl(auVar140,auVar141);
    fVar185 = auVar125._0_4_;
    fVar197 = auVar125._4_4_;
    fVar199 = auVar125._8_4_;
    fVar201 = auVar125._12_4_;
    fVar184 = auVar125._16_4_;
    fVar226 = auVar125._20_4_;
    fVar204 = auVar125._24_4_;
    auVar146._4_4_ = fVar197 * fVar197 * fVar197 * auVar132._4_4_;
    auVar146._0_4_ = fVar185 * fVar185 * fVar185 * auVar132._0_4_;
    auVar146._8_4_ = fVar199 * fVar199 * fVar199 * auVar132._8_4_;
    auVar146._12_4_ = fVar201 * fVar201 * fVar201 * auVar132._12_4_;
    auVar146._16_4_ = fVar184 * fVar184 * fVar184 * auVar132._16_4_;
    auVar146._20_4_ = fVar226 * fVar226 * fVar226 * auVar132._20_4_;
    auVar146._24_4_ = fVar204 * fVar204 * fVar204 * auVar132._24_4_;
    auVar146._28_4_ = auVar142._28_4_;
    auVar140._8_4_ = 0x3fc00000;
    auVar140._0_8_ = 0x3fc000003fc00000;
    auVar140._12_4_ = 0x3fc00000;
    auVar140._16_4_ = 0x3fc00000;
    auVar140._20_4_ = 0x3fc00000;
    auVar140._24_4_ = 0x3fc00000;
    auVar140._28_4_ = 0x3fc00000;
    auVar125 = vfmadd231ps_avx512vl(auVar146,auVar125,auVar140);
    auVar274 = ZEXT3264(auVar125);
    auVar132 = vmulps_avx512vl(auVar111,auVar125);
    auVar133 = vmulps_avx512vl(auVar112,auVar125);
    auVar137 = vmulps_avx512vl(auVar126,auVar125);
    auVar248 = ZEXT1632(auVar98);
    auVar138 = vsubps_avx512vl(auVar147,auVar248);
    auVar139 = vsubps_avx512vl(auVar147,auVar127);
    auVar141 = vsubps_avx512vl(auVar147,auVar128);
    auVar140 = vmulps_avx512vl(auVar276._0_32_,auVar141);
    auVar140 = vfmadd231ps_avx512vl(auVar140,local_640,auVar139);
    auVar140 = vfmadd231ps_avx512vl(auVar140,auVar275._0_32_,auVar138);
    auVar142 = vmulps_avx512vl(auVar141,auVar141);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar139,auVar139);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar138,auVar138);
    auVar143 = vmulps_avx512vl(auVar276._0_32_,auVar137);
    auVar143 = vfmadd231ps_avx512vl(auVar143,auVar133,local_640);
    auVar143 = vfmadd231ps_avx512vl(auVar143,auVar132,auVar275._0_32_);
    auVar137 = vmulps_avx512vl(auVar141,auVar137);
    auVar133 = vfmadd231ps_avx512vl(auVar137,auVar139,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar138,auVar132);
    auVar133 = vmulps_avx512vl(auVar143,auVar143);
    auVar137 = vsubps_avx512vl(local_560,auVar133);
    auVar144 = vmulps_avx512vl(auVar143,auVar132);
    auVar140 = vsubps_avx512vl(auVar140,auVar144);
    auVar140 = vaddps_avx512vl(auVar140,auVar140);
    auVar144 = vmulps_avx512vl(auVar132,auVar132);
    auVar144 = vsubps_avx512vl(auVar142,auVar144);
    auVar114 = vsubps_avx512vl(auVar144,auVar114);
    local_740 = vmulps_avx512vl(auVar140,auVar140);
    auVar142._8_4_ = 0x40800000;
    auVar142._0_8_ = 0x4080000040800000;
    auVar142._12_4_ = 0x40800000;
    auVar142._16_4_ = 0x40800000;
    auVar142._20_4_ = 0x40800000;
    auVar142._24_4_ = 0x40800000;
    auVar142._28_4_ = 0x40800000;
    _local_760 = vmulps_avx512vl(auVar137,auVar142);
    auVar142 = vmulps_avx512vl(_local_760,auVar114);
    auVar142 = vsubps_avx512vl(local_740,auVar142);
    uVar95 = vcmpps_avx512vl(auVar142,auVar147,5);
    bVar82 = (byte)uVar95;
    fVar185 = (float)local_960._0_4_;
    fVar197 = (float)local_960._4_4_;
    fVar199 = fStack_958;
    fVar201 = fStack_954;
    fVar184 = fStack_950;
    fVar226 = fStack_94c;
    fVar204 = fStack_948;
    fVar206 = fStack_944;
    if (bVar82 == 0) {
      auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
LAB_01a145ca:
      auVar275 = ZEXT3264(local_980);
      auVar276 = ZEXT3264(local_9a0);
      auVar266 = ZEXT3264(local_a40);
      auVar267 = ZEXT3264(local_a60);
      auVar263 = ZEXT3264(local_a00);
      auVar265 = ZEXT3264(local_a20);
    }
    else {
      local_8c0._0_32_ = auVar144;
      auVar142 = vsqrtps_avx512vl(auVar142);
      auVar145 = vaddps_avx512vl(auVar137,auVar137);
      _local_9e0 = vrcp14ps_avx512vl(auVar145);
      auVar146 = vfnmadd213ps_avx512vl(_local_9e0,auVar145,auVar277);
      auVar146 = vfmadd132ps_avx512vl(auVar146,_local_9e0,_local_9e0);
      auVar277._8_4_ = 0x80000000;
      auVar277._0_8_ = 0x8000000080000000;
      auVar277._12_4_ = 0x80000000;
      auVar277._16_4_ = 0x80000000;
      auVar277._20_4_ = 0x80000000;
      auVar277._24_4_ = 0x80000000;
      auVar277._28_4_ = 0x80000000;
      local_780 = vxorps_avx512vl(auVar140,auVar277);
      auVar147 = vsubps_avx512vl(local_780,auVar142);
      local_940 = vmulps_avx512vl(auVar147,auVar146);
      auVar142 = vsubps_avx512vl(auVar142,auVar140);
      local_7a0 = vmulps_avx512vl(auVar142,auVar146);
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar146 = vblendmps_avx512vl(auVar142,local_940);
      auVar148._0_4_ =
           (uint)(bVar82 & 1) * auVar146._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar142._0_4_;
      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar148._4_4_ = (uint)bVar92 * auVar146._4_4_ | (uint)!bVar92 * auVar142._4_4_;
      bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar148._8_4_ = (uint)bVar92 * auVar146._8_4_ | (uint)!bVar92 * auVar142._8_4_;
      bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar148._12_4_ = (uint)bVar92 * auVar146._12_4_ | (uint)!bVar92 * auVar142._12_4_;
      bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar148._16_4_ = (uint)bVar92 * auVar146._16_4_ | (uint)!bVar92 * auVar142._16_4_;
      bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar148._20_4_ = (uint)bVar92 * auVar146._20_4_ | (uint)!bVar92 * auVar142._20_4_;
      bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar148._24_4_ = (uint)bVar92 * auVar146._24_4_ | (uint)!bVar92 * auVar142._24_4_;
      bVar92 = SUB81(uVar95 >> 7,0);
      auVar148._28_4_ = (uint)bVar92 * auVar146._28_4_ | (uint)!bVar92 * auVar142._28_4_;
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar146 = vblendmps_avx512vl(auVar142,local_7a0);
      auVar149._0_4_ =
           (uint)(bVar82 & 1) * auVar146._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar142._0_4_;
      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar149._4_4_ = (uint)bVar92 * auVar146._4_4_ | (uint)!bVar92 * auVar142._4_4_;
      bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar149._8_4_ = (uint)bVar92 * auVar146._8_4_ | (uint)!bVar92 * auVar142._8_4_;
      bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar149._12_4_ = (uint)bVar92 * auVar146._12_4_ | (uint)!bVar92 * auVar142._12_4_;
      bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar149._16_4_ = (uint)bVar92 * auVar146._16_4_ | (uint)!bVar92 * auVar142._16_4_;
      bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar149._20_4_ = (uint)bVar92 * auVar146._20_4_ | (uint)!bVar92 * auVar142._20_4_;
      bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar149._24_4_ = (uint)bVar92 * auVar146._24_4_ | (uint)!bVar92 * auVar142._24_4_;
      bVar92 = SUB81(uVar95 >> 7,0);
      auVar149._28_4_ = (uint)bVar92 * auVar146._28_4_ | (uint)!bVar92 * auVar142._28_4_;
      auVar142 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar133,auVar142);
      local_7c0 = vmaxps_avx512vl(local_580,auVar142);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_7e0 = vmulps_avx512vl(local_7c0,auVar37);
      vandps_avx512vl(auVar137,auVar142);
      uVar24 = vcmpps_avx512vl(local_7e0,local_7e0,1);
      uVar95 = uVar95 & uVar24;
      bVar90 = (byte)uVar95;
      if (bVar90 != 0) {
        uVar24 = vcmpps_avx512vl(auVar114,_DAT_01f7b000,2);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar133 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar137 = vblendmps_avx512vl(auVar114,auVar133);
        bVar88 = (byte)uVar24;
        uVar96 = (uint)(bVar88 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar88 & 1) * local_7e0._0_4_;
        bVar92 = (bool)((byte)(uVar24 >> 1) & 1);
        uVar161 = (uint)bVar92 * auVar137._4_4_ | (uint)!bVar92 * local_7e0._4_4_;
        bVar92 = (bool)((byte)(uVar24 >> 2) & 1);
        uVar162 = (uint)bVar92 * auVar137._8_4_ | (uint)!bVar92 * local_7e0._8_4_;
        bVar92 = (bool)((byte)(uVar24 >> 3) & 1);
        uVar163 = (uint)bVar92 * auVar137._12_4_ | (uint)!bVar92 * local_7e0._12_4_;
        bVar92 = (bool)((byte)(uVar24 >> 4) & 1);
        uVar164 = (uint)bVar92 * auVar137._16_4_ | (uint)!bVar92 * local_7e0._16_4_;
        bVar92 = (bool)((byte)(uVar24 >> 5) & 1);
        uVar165 = (uint)bVar92 * auVar137._20_4_ | (uint)!bVar92 * local_7e0._20_4_;
        bVar92 = (bool)((byte)(uVar24 >> 6) & 1);
        uVar166 = (uint)bVar92 * auVar137._24_4_ | (uint)!bVar92 * local_7e0._24_4_;
        bVar92 = SUB81(uVar24 >> 7,0);
        uVar167 = (uint)bVar92 * auVar137._28_4_ | (uint)!bVar92 * local_7e0._28_4_;
        auVar148._0_4_ = (bVar90 & 1) * uVar96 | !(bool)(bVar90 & 1) * auVar148._0_4_;
        bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar148._4_4_ = bVar92 * uVar161 | !bVar92 * auVar148._4_4_;
        bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar148._8_4_ = bVar92 * uVar162 | !bVar92 * auVar148._8_4_;
        bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar148._12_4_ = bVar92 * uVar163 | !bVar92 * auVar148._12_4_;
        bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar148._16_4_ = bVar92 * uVar164 | !bVar92 * auVar148._16_4_;
        bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar148._20_4_ = bVar92 * uVar165 | !bVar92 * auVar148._20_4_;
        bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar148._24_4_ = bVar92 * uVar166 | !bVar92 * auVar148._24_4_;
        bVar92 = SUB81(uVar95 >> 7,0);
        auVar148._28_4_ = bVar92 * uVar167 | !bVar92 * auVar148._28_4_;
        auVar114 = vblendmps_avx512vl(auVar133,auVar114);
        bVar92 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar15 = SUB81(uVar24 >> 7,0);
        auVar149._0_4_ =
             (uint)(bVar90 & 1) *
             ((uint)(bVar88 & 1) * auVar114._0_4_ | !(bool)(bVar88 & 1) * uVar96) |
             !(bool)(bVar90 & 1) * auVar149._0_4_;
        bVar9 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar149._4_4_ =
             (uint)bVar9 * ((uint)bVar92 * auVar114._4_4_ | !bVar92 * uVar161) |
             !bVar9 * auVar149._4_4_;
        bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar149._8_4_ =
             (uint)bVar92 * ((uint)bVar10 * auVar114._8_4_ | !bVar10 * uVar162) |
             !bVar92 * auVar149._8_4_;
        bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar149._12_4_ =
             (uint)bVar92 * ((uint)bVar11 * auVar114._12_4_ | !bVar11 * uVar163) |
             !bVar92 * auVar149._12_4_;
        bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar149._16_4_ =
             (uint)bVar92 * ((uint)bVar12 * auVar114._16_4_ | !bVar12 * uVar164) |
             !bVar92 * auVar149._16_4_;
        bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar149._20_4_ =
             (uint)bVar92 * ((uint)bVar13 * auVar114._20_4_ | !bVar13 * uVar165) |
             !bVar92 * auVar149._20_4_;
        bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar149._24_4_ =
             (uint)bVar92 * ((uint)bVar14 * auVar114._24_4_ | !bVar14 * uVar166) |
             !bVar92 * auVar149._24_4_;
        bVar92 = SUB81(uVar95 >> 7,0);
        auVar149._28_4_ =
             (uint)bVar92 * ((uint)bVar15 * auVar114._28_4_ | !bVar15 * uVar167) |
             !bVar92 * auVar149._28_4_;
        bVar82 = (~bVar90 | bVar88) & bVar82;
      }
      if ((bVar82 & 0x7f) == 0) {
        auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar278 = ZEXT3264(auVar114);
        goto LAB_01a145ca;
      }
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar133 = vxorps_avx512vl(auVar136,auVar114);
      auVar134 = vxorps_avx512vl(auVar134,auVar114);
      uVar96 = *(uint *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
      auVar182 = ZEXT464(uVar96);
      auVar135 = vxorps_avx512vl(auVar135,auVar114);
      auVar97 = vsubss_avx512f(ZEXT416(uVar96),ZEXT416((uint)local_910._0_4_));
      auVar136 = vbroadcastss_avx512vl(auVar97);
      auVar136 = vminps_avx512vl(auVar136,auVar149);
      auVar81._4_4_ = fStack_59c;
      auVar81._0_4_ = local_5a0;
      auVar81._8_4_ = fStack_598;
      auVar81._12_4_ = fStack_594;
      auVar81._16_4_ = fStack_590;
      auVar81._20_4_ = fStack_58c;
      auVar81._24_4_ = fStack_588;
      auVar81._28_4_ = fStack_584;
      auVar137 = vmaxps_avx512vl(auVar81,auVar148);
      auVar141 = vmulps_avx512vl(auVar141,auVar150);
      auVar139 = vfmadd213ps_avx512vl(auVar139,auVar270,auVar141);
      auVar97 = vfmadd213ps_fma(auVar138,auVar268,auVar139);
      auVar138 = vmulps_avx512vl(local_9a0,auVar150);
      auVar138 = vfmadd231ps_avx512vl(auVar138,local_640,auVar270);
      auVar138 = vfmadd231ps_avx512vl(auVar138,local_980,auVar268);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar138,auVar139);
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar23 = vcmpps_avx512vl(auVar139,auVar141,1);
      auVar142 = vxorps_avx512vl(ZEXT1632(auVar97),auVar114);
      auVar150 = vrcp14ps_avx512vl(auVar138);
      auVar146 = vxorps_avx512vl(auVar138,auVar114);
      auVar147 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar151 = vfnmadd213ps_avx512vl(auVar150,auVar138,auVar147);
      auVar97 = vfmadd132ps_fma(auVar151,auVar150,auVar150);
      fVar186 = auVar97._0_4_ * auVar142._0_4_;
      fVar198 = auVar97._4_4_ * auVar142._4_4_;
      auVar43._4_4_ = fVar198;
      auVar43._0_4_ = fVar186;
      fVar200 = auVar97._8_4_ * auVar142._8_4_;
      auVar43._8_4_ = fVar200;
      fVar202 = auVar97._12_4_ * auVar142._12_4_;
      auVar43._12_4_ = fVar202;
      fVar203 = auVar142._16_4_ * 0.0;
      auVar43._16_4_ = fVar203;
      fVar205 = auVar142._20_4_ * 0.0;
      auVar43._20_4_ = fVar205;
      fVar207 = auVar142._24_4_ * 0.0;
      auVar43._24_4_ = fVar207;
      auVar43._28_4_ = auVar142._28_4_;
      uVar26 = vcmpps_avx512vl(auVar138,auVar146,1);
      bVar90 = (byte)uVar23 | (byte)uVar26;
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar151 = vblendmps_avx512vl(auVar43,auVar272);
      auVar152._0_4_ =
           (uint)(bVar90 & 1) * auVar151._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar150._0_4_;
      bVar92 = (bool)(bVar90 >> 1 & 1);
      auVar152._4_4_ = (uint)bVar92 * auVar151._4_4_ | (uint)!bVar92 * auVar150._4_4_;
      bVar92 = (bool)(bVar90 >> 2 & 1);
      auVar152._8_4_ = (uint)bVar92 * auVar151._8_4_ | (uint)!bVar92 * auVar150._8_4_;
      bVar92 = (bool)(bVar90 >> 3 & 1);
      auVar152._12_4_ = (uint)bVar92 * auVar151._12_4_ | (uint)!bVar92 * auVar150._12_4_;
      bVar92 = (bool)(bVar90 >> 4 & 1);
      auVar152._16_4_ = (uint)bVar92 * auVar151._16_4_ | (uint)!bVar92 * auVar150._16_4_;
      bVar92 = (bool)(bVar90 >> 5 & 1);
      auVar152._20_4_ = (uint)bVar92 * auVar151._20_4_ | (uint)!bVar92 * auVar150._20_4_;
      bVar92 = (bool)(bVar90 >> 6 & 1);
      auVar152._24_4_ = (uint)bVar92 * auVar151._24_4_ | (uint)!bVar92 * auVar150._24_4_;
      auVar152._28_4_ =
           (uint)(bVar90 >> 7) * auVar151._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar150._28_4_;
      auVar137 = vmaxps_avx512vl(auVar137,auVar152);
      uVar26 = vcmpps_avx512vl(auVar138,auVar146,6);
      bVar90 = (byte)uVar23 | (byte)uVar26;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar153._0_4_ =
           (uint)(bVar90 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar90 & 1) * (int)fVar186;
      bVar92 = (bool)(bVar90 >> 1 & 1);
      auVar153._4_4_ = (uint)bVar92 * auVar138._4_4_ | (uint)!bVar92 * (int)fVar198;
      bVar92 = (bool)(bVar90 >> 2 & 1);
      auVar153._8_4_ = (uint)bVar92 * auVar138._8_4_ | (uint)!bVar92 * (int)fVar200;
      bVar92 = (bool)(bVar90 >> 3 & 1);
      auVar153._12_4_ = (uint)bVar92 * auVar138._12_4_ | (uint)!bVar92 * (int)fVar202;
      bVar92 = (bool)(bVar90 >> 4 & 1);
      auVar153._16_4_ = (uint)bVar92 * auVar138._16_4_ | (uint)!bVar92 * (int)fVar203;
      bVar92 = (bool)(bVar90 >> 5 & 1);
      auVar153._20_4_ = (uint)bVar92 * auVar138._20_4_ | (uint)!bVar92 * (int)fVar205;
      bVar92 = (bool)(bVar90 >> 6 & 1);
      auVar153._24_4_ = (uint)bVar92 * auVar138._24_4_ | (uint)!bVar92 * (int)fVar207;
      auVar153._28_4_ =
           (uint)(bVar90 >> 7) * auVar138._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar142._28_4_;
      auVar142 = vminps_avx512vl(auVar136,auVar153);
      auVar97 = vxorps_avx512vl(auVar136._0_16_,auVar136._0_16_);
      auVar129 = vsubps_avx512vl(ZEXT1632(auVar97),auVar129);
      auVar130 = vsubps_avx512vl(ZEXT1632(auVar97),auVar130);
      auVar136 = ZEXT1632(auVar97);
      auVar131 = vsubps_avx512vl(auVar136,auVar131);
      auVar131 = vmulps_avx512vl(auVar131,auVar133);
      auVar130 = vfmadd231ps_avx512vl(auVar131,auVar135,auVar130);
      auVar129 = vfmadd231ps_avx512vl(auVar130,auVar134,auVar129);
      auVar130 = vmulps_avx512vl(local_9a0,auVar133);
      auVar130 = vfmadd231ps_avx512vl(auVar130,local_640,auVar135);
      auVar130 = vfmadd231ps_avx512vl(auVar130,local_980,auVar134);
      vandps_avx512vl(auVar130,auVar139);
      uVar23 = vcmpps_avx512vl(auVar130,auVar141,1);
      auVar129 = vxorps_avx512vl(auVar129,auVar114);
      auVar131 = vrcp14ps_avx512vl(auVar130);
      auVar114 = vxorps_avx512vl(auVar130,auVar114);
      auVar133 = vfnmadd213ps_avx512vl(auVar131,auVar130,auVar147);
      auVar97 = vfmadd132ps_fma(auVar133,auVar131,auVar131);
      fVar186 = auVar97._0_4_ * auVar129._0_4_;
      fVar198 = auVar97._4_4_ * auVar129._4_4_;
      auVar44._4_4_ = fVar198;
      auVar44._0_4_ = fVar186;
      fVar200 = auVar97._8_4_ * auVar129._8_4_;
      auVar44._8_4_ = fVar200;
      fVar202 = auVar97._12_4_ * auVar129._12_4_;
      auVar44._12_4_ = fVar202;
      fVar203 = auVar129._16_4_ * 0.0;
      auVar44._16_4_ = fVar203;
      fVar205 = auVar129._20_4_ * 0.0;
      auVar44._20_4_ = fVar205;
      fVar207 = auVar129._24_4_ * 0.0;
      auVar44._24_4_ = fVar207;
      auVar44._28_4_ = auVar129._28_4_;
      uVar26 = vcmpps_avx512vl(auVar130,auVar114,1);
      bVar90 = (byte)uVar23 | (byte)uVar26;
      auVar133 = vblendmps_avx512vl(auVar44,auVar272);
      auVar154._0_4_ =
           (uint)(bVar90 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar131._0_4_;
      bVar92 = (bool)(bVar90 >> 1 & 1);
      auVar154._4_4_ = (uint)bVar92 * auVar133._4_4_ | (uint)!bVar92 * auVar131._4_4_;
      bVar92 = (bool)(bVar90 >> 2 & 1);
      auVar154._8_4_ = (uint)bVar92 * auVar133._8_4_ | (uint)!bVar92 * auVar131._8_4_;
      bVar92 = (bool)(bVar90 >> 3 & 1);
      auVar154._12_4_ = (uint)bVar92 * auVar133._12_4_ | (uint)!bVar92 * auVar131._12_4_;
      bVar92 = (bool)(bVar90 >> 4 & 1);
      auVar154._16_4_ = (uint)bVar92 * auVar133._16_4_ | (uint)!bVar92 * auVar131._16_4_;
      bVar92 = (bool)(bVar90 >> 5 & 1);
      auVar154._20_4_ = (uint)bVar92 * auVar133._20_4_ | (uint)!bVar92 * auVar131._20_4_;
      bVar92 = (bool)(bVar90 >> 6 & 1);
      auVar154._24_4_ = (uint)bVar92 * auVar133._24_4_ | (uint)!bVar92 * auVar131._24_4_;
      auVar154._28_4_ =
           (uint)(bVar90 >> 7) * auVar133._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar131._28_4_;
      local_720 = vmaxps_avx(auVar137,auVar154);
      uVar26 = vcmpps_avx512vl(auVar130,auVar114,6);
      bVar90 = (byte)uVar23 | (byte)uVar26;
      auVar155._0_4_ =
           (uint)(bVar90 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar90 & 1) * (int)fVar186;
      bVar92 = (bool)(bVar90 >> 1 & 1);
      auVar155._4_4_ = (uint)bVar92 * auVar138._4_4_ | (uint)!bVar92 * (int)fVar198;
      bVar92 = (bool)(bVar90 >> 2 & 1);
      auVar155._8_4_ = (uint)bVar92 * auVar138._8_4_ | (uint)!bVar92 * (int)fVar200;
      bVar92 = (bool)(bVar90 >> 3 & 1);
      auVar155._12_4_ = (uint)bVar92 * auVar138._12_4_ | (uint)!bVar92 * (int)fVar202;
      bVar92 = (bool)(bVar90 >> 4 & 1);
      auVar155._16_4_ = (uint)bVar92 * auVar138._16_4_ | (uint)!bVar92 * (int)fVar203;
      bVar92 = (bool)(bVar90 >> 5 & 1);
      auVar155._20_4_ = (uint)bVar92 * auVar138._20_4_ | (uint)!bVar92 * (int)fVar205;
      bVar92 = (bool)(bVar90 >> 6 & 1);
      auVar155._24_4_ = (uint)bVar92 * auVar138._24_4_ | (uint)!bVar92 * (int)fVar207;
      auVar155._28_4_ =
           (uint)(bVar90 >> 7) * auVar138._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar129._28_4_;
      local_600 = vminps_avx(auVar142,auVar155);
      uVar23 = vcmpps_avx512vl(local_720,local_600,2);
      bVar82 = bVar82 & 0x7f & (byte)uVar23;
      if (bVar82 == 0) {
        auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar278 = ZEXT3264(auVar147);
        goto LAB_01a145ca;
      }
      auVar129 = vmaxps_avx512vl(auVar136,local_aa0);
      auVar114 = vfmadd213ps_avx512vl(local_940,auVar143,auVar132);
      fVar186 = auVar125._0_4_;
      fVar198 = auVar125._4_4_;
      auVar45._4_4_ = fVar198 * auVar114._4_4_;
      auVar45._0_4_ = fVar186 * auVar114._0_4_;
      fVar200 = auVar125._8_4_;
      auVar45._8_4_ = fVar200 * auVar114._8_4_;
      fVar202 = auVar125._12_4_;
      auVar45._12_4_ = fVar202 * auVar114._12_4_;
      fVar203 = auVar125._16_4_;
      auVar45._16_4_ = fVar203 * auVar114._16_4_;
      fVar205 = auVar125._20_4_;
      auVar45._20_4_ = fVar205 * auVar114._20_4_;
      fVar207 = auVar125._24_4_;
      auVar45._24_4_ = fVar207 * auVar114._24_4_;
      auVar45._28_4_ = auVar114._28_4_;
      auVar114 = vfmadd213ps_avx512vl(local_7a0,auVar143,auVar132);
      auVar46._4_4_ = fVar198 * auVar114._4_4_;
      auVar46._0_4_ = fVar186 * auVar114._0_4_;
      auVar46._8_4_ = fVar200 * auVar114._8_4_;
      auVar46._12_4_ = fVar202 * auVar114._12_4_;
      auVar46._16_4_ = fVar203 * auVar114._16_4_;
      auVar46._20_4_ = fVar205 * auVar114._20_4_;
      auVar46._24_4_ = fVar207 * auVar114._24_4_;
      auVar46._28_4_ = auVar114._28_4_;
      auVar114 = vminps_avx512vl(auVar45,auVar147);
      auVar130 = ZEXT832(0) << 0x20;
      auVar114 = vmaxps_avx(auVar114,ZEXT832(0) << 0x20);
      auVar131 = vminps_avx512vl(auVar46,auVar147);
      auVar47._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar114._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar47,auVar247,auVar241);
      auVar114 = vmaxps_avx(auVar131,ZEXT832(0) << 0x20);
      auVar48._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar114._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar48,auVar247,auVar241);
      auVar49._4_4_ = auVar129._4_4_ * auVar129._4_4_;
      auVar49._0_4_ = auVar129._0_4_ * auVar129._0_4_;
      auVar49._8_4_ = auVar129._8_4_ * auVar129._8_4_;
      auVar49._12_4_ = auVar129._12_4_ * auVar129._12_4_;
      auVar49._16_4_ = auVar129._16_4_ * auVar129._16_4_;
      auVar49._20_4_ = auVar129._20_4_ * auVar129._20_4_;
      auVar49._24_4_ = auVar129._24_4_ * auVar129._24_4_;
      auVar49._28_4_ = auVar129._28_4_;
      auVar114 = vsubps_avx(auVar144,auVar49);
      auVar50._4_4_ = auVar114._4_4_ * (float)local_760._4_4_;
      auVar50._0_4_ = auVar114._0_4_ * (float)local_760._0_4_;
      auVar50._8_4_ = auVar114._8_4_ * fStack_758;
      auVar50._12_4_ = auVar114._12_4_ * fStack_754;
      auVar50._16_4_ = auVar114._16_4_ * fStack_750;
      auVar50._20_4_ = auVar114._20_4_ * fStack_74c;
      auVar50._24_4_ = auVar114._24_4_ * fStack_748;
      auVar50._28_4_ = auVar129._28_4_;
      auVar129 = vsubps_avx(local_740,auVar50);
      uVar23 = vcmpps_avx512vl(auVar129,ZEXT832(0) << 0x20,5);
      bVar90 = (byte)uVar23;
      if (bVar90 == 0) {
        bVar90 = 0;
        auVar125 = ZEXT832(0) << 0x20;
        auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar131 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar133 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar129 = ZEXT832(0) << 0x20;
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar157._8_4_ = 0xff800000;
        auVar157._0_8_ = 0xff800000ff800000;
        auVar157._12_4_ = 0xff800000;
        auVar157._16_4_ = 0xff800000;
        auVar157._20_4_ = 0xff800000;
        auVar157._24_4_ = 0xff800000;
        auVar157._28_4_ = 0xff800000;
      }
      else {
        auVar100 = vxorps_avx512vl(auVar139._0_16_,auVar139._0_16_);
        uVar95 = vcmpps_avx512vl(auVar129,auVar136,5);
        auVar129 = vsqrtps_avx(auVar129);
        auVar130 = vfnmadd213ps_avx512vl(auVar145,_local_9e0,auVar147);
        auVar133 = vfmadd132ps_avx512vl(auVar130,_local_9e0,_local_9e0);
        auVar130 = vsubps_avx(local_780,auVar129);
        auVar134 = vmulps_avx512vl(auVar130,auVar133);
        auVar129 = vsubps_avx512vl(auVar129,auVar140);
        auVar135 = vmulps_avx512vl(auVar129,auVar133);
        auVar129 = vfmadd213ps_avx512vl(auVar143,auVar134,auVar132);
        auVar51._4_4_ = fVar198 * auVar129._4_4_;
        auVar51._0_4_ = fVar186 * auVar129._0_4_;
        auVar51._8_4_ = fVar200 * auVar129._8_4_;
        auVar51._12_4_ = fVar202 * auVar129._12_4_;
        auVar51._16_4_ = fVar203 * auVar129._16_4_;
        auVar51._20_4_ = fVar205 * auVar129._20_4_;
        auVar51._24_4_ = fVar207 * auVar129._24_4_;
        auVar51._28_4_ = auVar131._28_4_;
        auVar129 = vmulps_avx512vl(local_980,auVar134);
        auVar130 = vmulps_avx512vl(local_640,auVar134);
        auVar136 = vmulps_avx512vl(local_9a0,auVar134);
        auVar131 = vfmadd213ps_avx512vl(auVar111,auVar51,auVar248);
        auVar131 = vsubps_avx512vl(auVar129,auVar131);
        auVar129 = vfmadd213ps_avx512vl(auVar112,auVar51,auVar127);
        auVar133 = vsubps_avx512vl(auVar130,auVar129);
        auVar97 = vfmadd213ps_fma(auVar51,auVar126,auVar128);
        auVar129 = vsubps_avx(auVar136,ZEXT1632(auVar97));
        auVar130 = vfmadd213ps_avx512vl(auVar143,auVar135,auVar132);
        auVar132 = vmulps_avx512vl(auVar125,auVar130);
        auVar274 = ZEXT3264(auVar132);
        auVar125 = vmulps_avx512vl(local_980,auVar135);
        auVar136 = vmulps_avx512vl(local_640,auVar135);
        auVar137 = vmulps_avx512vl(local_9a0,auVar135);
        auVar97 = vfmadd213ps_fma(auVar111,auVar132,auVar248);
        auVar130 = vsubps_avx(auVar125,ZEXT1632(auVar97));
        auVar97 = vfmadd213ps_fma(auVar112,auVar132,auVar127);
        auVar125 = vsubps_avx512vl(auVar136,ZEXT1632(auVar97));
        auVar97 = vfmadd213ps_fma(auVar126,auVar132,auVar128);
        auVar111 = vsubps_avx512vl(auVar137,ZEXT1632(auVar97));
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar112 = vblendmps_avx512vl(auVar222,auVar134);
        bVar92 = (bool)((byte)uVar95 & 1);
        auVar156._0_4_ = (uint)bVar92 * auVar112._0_4_ | (uint)!bVar92 * auVar98._0_4_;
        bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar156._4_4_ = (uint)bVar92 * auVar112._4_4_ | (uint)!bVar92 * auVar98._4_4_;
        bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar156._8_4_ = (uint)bVar92 * auVar112._8_4_ | (uint)!bVar92 * auVar98._8_4_;
        bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar156._12_4_ = (uint)bVar92 * auVar112._12_4_ | (uint)!bVar92 * auVar98._12_4_;
        iVar1 = (uint)((byte)(uVar95 >> 4) & 1) * auVar112._16_4_;
        auVar156._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar95 >> 5) & 1) * auVar112._20_4_;
        auVar156._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar95 >> 6) & 1) * auVar112._24_4_;
        auVar156._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar95 >> 7) * auVar112._28_4_;
        auVar156._28_4_ = iVar4;
        auVar223._8_4_ = 0xff800000;
        auVar223._0_8_ = 0xff800000ff800000;
        auVar223._12_4_ = 0xff800000;
        auVar223._16_4_ = 0xff800000;
        auVar223._20_4_ = 0xff800000;
        auVar223._24_4_ = 0xff800000;
        auVar223._28_4_ = 0xff800000;
        auVar112 = vblendmps_avx512vl(auVar223,auVar135);
        bVar92 = (bool)((byte)uVar95 & 1);
        auVar157._0_4_ = (uint)bVar92 * auVar112._0_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar157._4_4_ = (uint)bVar92 * auVar112._4_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar157._8_4_ = (uint)bVar92 * auVar112._8_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar157._12_4_ = (uint)bVar92 * auVar112._12_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar157._16_4_ = (uint)bVar92 * auVar112._16_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar157._20_4_ = (uint)bVar92 * auVar112._20_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar157._24_4_ = (uint)bVar92 * auVar112._24_4_ | (uint)!bVar92 * -0x800000;
        bVar92 = SUB81(uVar95 >> 7,0);
        auVar157._28_4_ = (uint)bVar92 * auVar112._28_4_ | (uint)!bVar92 * -0x800000;
        auVar38._8_4_ = 0x36000000;
        auVar38._0_8_ = 0x3600000036000000;
        auVar38._12_4_ = 0x36000000;
        auVar38._16_4_ = 0x36000000;
        auVar38._20_4_ = 0x36000000;
        auVar38._24_4_ = 0x36000000;
        auVar38._28_4_ = 0x36000000;
        auVar112 = vmulps_avx512vl(local_7c0,auVar38);
        uVar24 = vcmpps_avx512vl(auVar112,local_7e0,0xe);
        uVar95 = uVar95 & uVar24;
        bVar88 = (byte)uVar95;
        if (bVar88 != 0) {
          uVar24 = vcmpps_avx512vl(auVar114,ZEXT1632(auVar100),2);
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar269._8_4_ = 0xff800000;
          auVar269._0_8_ = 0xff800000ff800000;
          auVar269._12_4_ = 0xff800000;
          auVar269._16_4_ = 0xff800000;
          auVar269._20_4_ = 0xff800000;
          auVar269._24_4_ = 0xff800000;
          auVar269._28_4_ = 0xff800000;
          auVar114 = vblendmps_avx512vl(auVar264,auVar269);
          bVar83 = (byte)uVar24;
          uVar96 = (uint)(bVar83 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar112._0_4_;
          bVar92 = (bool)((byte)(uVar24 >> 1) & 1);
          uVar161 = (uint)bVar92 * auVar114._4_4_ | (uint)!bVar92 * auVar112._4_4_;
          bVar92 = (bool)((byte)(uVar24 >> 2) & 1);
          uVar162 = (uint)bVar92 * auVar114._8_4_ | (uint)!bVar92 * auVar112._8_4_;
          bVar92 = (bool)((byte)(uVar24 >> 3) & 1);
          uVar163 = (uint)bVar92 * auVar114._12_4_ | (uint)!bVar92 * auVar112._12_4_;
          bVar92 = (bool)((byte)(uVar24 >> 4) & 1);
          uVar164 = (uint)bVar92 * auVar114._16_4_ | (uint)!bVar92 * auVar112._16_4_;
          bVar92 = (bool)((byte)(uVar24 >> 5) & 1);
          uVar165 = (uint)bVar92 * auVar114._20_4_ | (uint)!bVar92 * auVar112._20_4_;
          bVar92 = (bool)((byte)(uVar24 >> 6) & 1);
          uVar166 = (uint)bVar92 * auVar114._24_4_ | (uint)!bVar92 * auVar112._24_4_;
          bVar92 = SUB81(uVar24 >> 7,0);
          uVar167 = (uint)bVar92 * auVar114._28_4_ | (uint)!bVar92 * auVar112._28_4_;
          auVar156._0_4_ = (bVar88 & 1) * uVar96 | !(bool)(bVar88 & 1) * auVar156._0_4_;
          bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
          auVar156._4_4_ = bVar92 * uVar161 | !bVar92 * auVar156._4_4_;
          bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
          auVar156._8_4_ = bVar92 * uVar162 | !bVar92 * auVar156._8_4_;
          bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
          auVar156._12_4_ = bVar92 * uVar163 | !bVar92 * auVar156._12_4_;
          bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
          auVar156._16_4_ = bVar92 * uVar164 | (uint)!bVar92 * iVar1;
          bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
          auVar156._20_4_ = bVar92 * uVar165 | (uint)!bVar92 * iVar2;
          bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
          auVar156._24_4_ = bVar92 * uVar166 | (uint)!bVar92 * iVar3;
          bVar92 = SUB81(uVar95 >> 7,0);
          auVar156._28_4_ = bVar92 * uVar167 | (uint)!bVar92 * iVar4;
          auVar114 = vblendmps_avx512vl(auVar269,auVar264);
          bVar92 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
          bVar15 = SUB81(uVar24 >> 7,0);
          auVar157._0_4_ =
               (uint)(bVar88 & 1) *
               ((uint)(bVar83 & 1) * auVar114._0_4_ | !(bool)(bVar83 & 1) * uVar96) |
               !(bool)(bVar88 & 1) * auVar157._0_4_;
          bVar9 = (bool)((byte)(uVar95 >> 1) & 1);
          auVar157._4_4_ =
               (uint)bVar9 * ((uint)bVar92 * auVar114._4_4_ | !bVar92 * uVar161) |
               !bVar9 * auVar157._4_4_;
          bVar92 = (bool)((byte)(uVar95 >> 2) & 1);
          auVar157._8_4_ =
               (uint)bVar92 * ((uint)bVar10 * auVar114._8_4_ | !bVar10 * uVar162) |
               !bVar92 * auVar157._8_4_;
          bVar92 = (bool)((byte)(uVar95 >> 3) & 1);
          auVar157._12_4_ =
               (uint)bVar92 * ((uint)bVar11 * auVar114._12_4_ | !bVar11 * uVar163) |
               !bVar92 * auVar157._12_4_;
          bVar92 = (bool)((byte)(uVar95 >> 4) & 1);
          auVar157._16_4_ =
               (uint)bVar92 * ((uint)bVar12 * auVar114._16_4_ | !bVar12 * uVar164) |
               !bVar92 * auVar157._16_4_;
          bVar92 = (bool)((byte)(uVar95 >> 5) & 1);
          auVar157._20_4_ =
               (uint)bVar92 * ((uint)bVar13 * auVar114._20_4_ | !bVar13 * uVar165) |
               !bVar92 * auVar157._20_4_;
          bVar92 = (bool)((byte)(uVar95 >> 6) & 1);
          auVar157._24_4_ =
               (uint)bVar92 * ((uint)bVar14 * auVar114._24_4_ | !bVar14 * uVar166) |
               !bVar92 * auVar157._24_4_;
          bVar92 = SUB81(uVar95 >> 7,0);
          auVar157._28_4_ =
               (uint)bVar92 * ((uint)bVar15 * auVar114._28_4_ | !bVar15 * uVar167) |
               !bVar92 * auVar157._28_4_;
          bVar90 = (~bVar88 | bVar83) & bVar90;
        }
      }
      auVar276 = ZEXT3264(local_9a0);
      auVar114 = vmulps_avx512vl(local_9a0,auVar111);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_640,auVar125);
      auVar275 = ZEXT3264(local_980);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_980,auVar130);
      _local_540 = local_720;
      local_520 = vminps_avx(local_600,auVar156);
      auVar261._8_4_ = 0x7fffffff;
      auVar261._0_8_ = 0x7fffffff7fffffff;
      auVar261._12_4_ = 0x7fffffff;
      auVar261._16_4_ = 0x7fffffff;
      auVar261._20_4_ = 0x7fffffff;
      auVar261._24_4_ = 0x7fffffff;
      auVar261._28_4_ = 0x7fffffff;
      auVar114 = vandps_avx(auVar114,auVar261);
      auVar258 = ZEXT3264(auVar261);
      _local_6c0 = vmaxps_avx(local_720,auVar157);
      auVar262._8_4_ = 0x3e99999a;
      auVar262._0_8_ = 0x3e99999a3e99999a;
      auVar262._12_4_ = 0x3e99999a;
      auVar262._16_4_ = 0x3e99999a;
      auVar262._20_4_ = 0x3e99999a;
      auVar262._24_4_ = 0x3e99999a;
      auVar262._28_4_ = 0x3e99999a;
      uVar23 = vcmpps_avx512vl(auVar114,auVar262,1);
      uVar26 = vcmpps_avx512vl(local_720,local_520,2);
      bVar88 = (byte)uVar26 & bVar82;
      uVar25 = vcmpps_avx512vl(_local_6c0,local_600,2);
      if ((bVar82 & ((byte)uVar25 | (byte)uVar26)) == 0) {
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar278 = ZEXT3264(auVar114);
        auVar266 = ZEXT3264(local_a40);
        auVar267 = ZEXT3264(local_a60);
        auVar263 = ZEXT3264(local_a00);
        auVar265 = ZEXT3264(local_a20);
      }
      else {
        bVar83 = (byte)uVar23 | ~bVar90;
        auVar114 = vmulps_avx512vl(local_9a0,auVar129);
        auVar97 = vfmadd213ps_fma(auVar133,local_640,auVar114);
        auVar114 = vfmadd213ps_avx512vl(auVar131,local_980,ZEXT1632(auVar97));
        auVar114 = vandps_avx(auVar114,auVar261);
        uVar23 = vcmpps_avx512vl(auVar114,auVar262,1);
        bVar90 = (byte)uVar23 | ~bVar90;
        auVar177._8_4_ = 2;
        auVar177._0_8_ = 0x200000002;
        auVar177._12_4_ = 2;
        auVar177._16_4_ = 2;
        auVar177._20_4_ = 2;
        auVar177._24_4_ = 2;
        auVar177._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar114 = vpblendmd_avx512vl(auVar177,auVar39);
        local_5e0._0_4_ = (uint)(bVar90 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar90 & 1) * 2;
        bVar92 = (bool)(bVar90 >> 1 & 1);
        local_5e0._4_4_ = (uint)bVar92 * auVar114._4_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar90 >> 2 & 1);
        local_5e0._8_4_ = (uint)bVar92 * auVar114._8_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar90 >> 3 & 1);
        local_5e0._12_4_ = (uint)bVar92 * auVar114._12_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar90 >> 4 & 1);
        local_5e0._16_4_ = (uint)bVar92 * auVar114._16_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar90 >> 5 & 1);
        local_5e0._20_4_ = (uint)bVar92 * auVar114._20_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar90 >> 6 & 1);
        local_5e0._24_4_ = (uint)bVar92 * auVar114._24_4_ | (uint)!bVar92 * 2;
        local_5e0._28_4_ = (uint)(bVar90 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar90 >> 7) * 2;
        local_660 = vpbroadcastd_avx512vl();
        uVar23 = vpcmpd_avx512vl(local_660,local_5e0,5);
        local_6a0 = local_720._0_4_ + (float)local_960._0_4_;
        fStack_69c = local_720._4_4_ + (float)local_960._4_4_;
        fStack_698 = local_720._8_4_ + fStack_958;
        fStack_694 = local_720._12_4_ + fStack_954;
        fStack_690 = local_720._16_4_ + fStack_950;
        fStack_68c = local_720._20_4_ + fStack_94c;
        fStack_688 = local_720._24_4_ + fStack_948;
        fStack_684 = local_720._28_4_ + fStack_944;
        _local_620 = _local_6c0;
        for (bVar90 = (byte)uVar23 & bVar88; bVar90 != 0;
            bVar90 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar90 & (byte)uVar23) {
          auVar178._8_4_ = 0x7f800000;
          auVar178._0_8_ = 0x7f8000007f800000;
          auVar178._12_4_ = 0x7f800000;
          auVar178._16_4_ = 0x7f800000;
          auVar178._20_4_ = 0x7f800000;
          auVar178._24_4_ = 0x7f800000;
          auVar178._28_4_ = 0x7f800000;
          auVar114 = vblendmps_avx512vl(auVar178,local_720);
          auVar159._0_4_ =
               (uint)(bVar90 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 1 & 1);
          auVar159._4_4_ = (uint)bVar92 * auVar114._4_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 2 & 1);
          auVar159._8_4_ = (uint)bVar92 * auVar114._8_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 3 & 1);
          auVar159._12_4_ = (uint)bVar92 * auVar114._12_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 4 & 1);
          auVar159._16_4_ = (uint)bVar92 * auVar114._16_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 5 & 1);
          auVar159._20_4_ = (uint)bVar92 * auVar114._20_4_ | (uint)!bVar92 * 0x7f800000;
          auVar159._24_4_ =
               (uint)(bVar90 >> 6) * auVar114._24_4_ | (uint)!(bool)(bVar90 >> 6) * 0x7f800000;
          auVar159._28_4_ = 0x7f800000;
          auVar114 = vshufps_avx(auVar159,auVar159,0xb1);
          auVar114 = vminps_avx(auVar159,auVar114);
          auVar125 = vshufpd_avx(auVar114,auVar114,5);
          auVar114 = vminps_avx(auVar114,auVar125);
          auVar125 = vpermpd_avx2(auVar114,0x4e);
          auVar114 = vminps_avx(auVar114,auVar125);
          uVar23 = vcmpps_avx512vl(auVar159,auVar114,0);
          bVar84 = (byte)uVar23 & bVar90;
          bVar85 = bVar90;
          if (bVar84 != 0) {
            bVar85 = bVar84;
          }
          iVar2 = 0;
          for (uVar96 = (uint)bVar85; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar96 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
          fVar185 = auVar22._0_4_;
          auVar97 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
          if ((float)local_9c0._0_4_ < 0.0) {
            local_aa0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            auVar274 = ZEXT1664(auVar274._0_16_);
            fVar185 = sqrtf((float)local_9c0._0_4_);
            auVar97 = local_aa0._0_16_;
          }
          auVar101 = vminps_avx(local_800._0_16_,local_840._0_16_);
          auVar100 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
          auVar103 = vminps_avx(local_820._0_16_,local_860._0_16_);
          auVar102 = vminps_avx(auVar101,auVar103);
          auVar101 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
          auVar103 = vmaxps_avx(auVar100,auVar101);
          auVar227._8_4_ = 0x7fffffff;
          auVar227._0_8_ = 0x7fffffff7fffffff;
          auVar227._12_4_ = 0x7fffffff;
          auVar100 = vandps_avx(auVar102,auVar227);
          auVar101 = vandps_avx(auVar103,auVar227);
          auVar100 = vmaxps_avx(auVar100,auVar101);
          auVar101 = vmovshdup_avx(auVar100);
          auVar101 = vmaxss_avx(auVar101,auVar100);
          auVar100 = vshufpd_avx(auVar100,auVar100,1);
          auVar100 = vmaxss_avx(auVar100,auVar101);
          fVar197 = auVar100._0_4_ * 1.9073486e-06;
          local_900 = vshufps_avx(auVar103,auVar103,0xff);
          auVar97 = vinsertps_avx(auVar97,ZEXT416(uVar96),0x10);
          auVar182 = ZEXT1664(auVar97);
          lVar89 = 5;
          do {
            do {
              bVar92 = lVar89 == 0;
              lVar89 = lVar89 + -1;
              if (bVar92) goto LAB_01a151c6;
              uVar169 = auVar182._0_4_;
              auVar170._4_4_ = uVar169;
              auVar170._0_4_ = uVar169;
              auVar170._8_4_ = uVar169;
              auVar170._12_4_ = uVar169;
              auVar100 = vfmadd132ps_fma(auVar170,ZEXT816(0) << 0x40,local_9b0);
              auVar101 = auVar182._0_16_;
              auVar97 = vmovshdup_avx(auVar101);
              local_780._0_16_ = auVar97;
              fVar204 = 1.0 - auVar97._0_4_;
              auVar97 = vshufps_avx(auVar101,auVar101,0x55);
              fVar199 = auVar97._0_4_;
              auVar208._0_4_ = local_840._0_4_ * fVar199;
              fVar201 = auVar97._4_4_;
              auVar208._4_4_ = local_840._4_4_ * fVar201;
              fVar184 = auVar97._8_4_;
              auVar208._8_4_ = local_840._8_4_ * fVar184;
              fVar226 = auVar97._12_4_;
              auVar208._12_4_ = local_840._12_4_ * fVar226;
              _local_760 = ZEXT416((uint)fVar204);
              auVar228._4_4_ = fVar204;
              auVar228._0_4_ = fVar204;
              auVar228._8_4_ = fVar204;
              auVar228._12_4_ = fVar204;
              auVar97 = vfmadd231ps_fma(auVar208,auVar228,local_800._0_16_);
              auVar243._0_4_ = local_820._0_4_ * fVar199;
              auVar243._4_4_ = local_820._4_4_ * fVar201;
              auVar243._8_4_ = local_820._8_4_ * fVar184;
              auVar243._12_4_ = local_820._12_4_ * fVar226;
              auVar101 = vfmadd231ps_fma(auVar243,auVar228,local_840._0_16_);
              auVar249._0_4_ = fVar199 * (float)local_860._0_4_;
              auVar249._4_4_ = fVar201 * (float)local_860._4_4_;
              auVar249._8_4_ = fVar184 * fStack_858;
              auVar249._12_4_ = fVar226 * fStack_854;
              auVar103 = vfmadd231ps_fma(auVar249,auVar228,local_820._0_16_);
              auVar255._0_4_ = fVar199 * auVar101._0_4_;
              auVar255._4_4_ = fVar201 * auVar101._4_4_;
              auVar255._8_4_ = fVar184 * auVar101._8_4_;
              auVar255._12_4_ = fVar226 * auVar101._12_4_;
              auVar97 = vfmadd231ps_fma(auVar255,auVar228,auVar97);
              auVar209._0_4_ = fVar199 * auVar103._0_4_;
              auVar209._4_4_ = fVar201 * auVar103._4_4_;
              auVar209._8_4_ = fVar184 * auVar103._8_4_;
              auVar209._12_4_ = fVar226 * auVar103._12_4_;
              auVar101 = vfmadd231ps_fma(auVar209,auVar228,auVar101);
              auVar244._0_4_ = fVar199 * auVar101._0_4_;
              auVar244._4_4_ = fVar201 * auVar101._4_4_;
              auVar244._8_4_ = fVar184 * auVar101._8_4_;
              auVar244._12_4_ = fVar226 * auVar101._12_4_;
              auVar103 = vfmadd231ps_fma(auVar244,auVar97,auVar228);
              auVar97 = vsubps_avx(auVar101,auVar97);
              auVar27._8_4_ = 0x40400000;
              auVar27._0_8_ = 0x4040000040400000;
              auVar27._12_4_ = 0x40400000;
              auVar101 = vmulps_avx512vl(auVar97,auVar27);
              local_740._0_16_ = auVar103;
              auVar100 = vsubps_avx(auVar100,auVar103);
              auVar97 = vdpps_avx(auVar100,auVar100,0x7f);
              local_aa0._0_16_ = auVar97;
              local_8c0 = auVar182;
              if (auVar97._0_4_ < 0.0) {
                auVar263._0_4_ = sqrtf(auVar97._0_4_);
                auVar263._4_60_ = extraout_var;
                auVar97 = auVar263._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
              }
              local_7a0._0_16_ = vdpps_avx(auVar101,auVar101,0x7f);
              fVar199 = local_7a0._0_4_;
              auVar210._4_12_ = ZEXT812(0) << 0x20;
              auVar210._0_4_ = fVar199;
              _local_9e0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              fVar201 = local_9e0._0_4_;
              local_7c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(local_7a0._0_16_,auVar28);
              auVar103 = vfnmadd213ss_fma(local_7c0._0_16_,local_7a0._0_16_,ZEXT416(0x40000000));
              local_7e0._0_4_ = auVar103._0_4_;
              local_940._0_4_ = auVar97._0_4_;
              if (fVar199 < auVar102._0_4_) {
                auVar265._0_4_ = sqrtf(fVar199);
                auVar265._4_60_ = extraout_var_00;
                auVar97 = ZEXT416((uint)local_940._0_4_);
                auVar103 = auVar265._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx512f(local_7a0._0_16_,local_7a0._0_16_);
              }
              fVar184 = local_9e0._0_4_;
              fVar199 = fVar201 * 1.5 + fVar199 * -0.5 * fVar184 * fVar184 * fVar184;
              local_9e0._0_4_ = auVar101._0_4_ * fVar199;
              local_9e0._4_4_ = auVar101._4_4_ * fVar199;
              fStack_9d8 = auVar101._8_4_ * fVar199;
              fStack_9d4 = auVar101._12_4_ * fVar199;
              auVar102 = vdpps_avx(auVar100,_local_9e0,0x7f);
              fVar184 = auVar97._0_4_;
              auVar171._0_4_ = auVar102._0_4_ * auVar102._0_4_;
              auVar171._4_4_ = auVar102._4_4_ * auVar102._4_4_;
              auVar171._8_4_ = auVar102._8_4_ * auVar102._8_4_;
              auVar171._12_4_ = auVar102._12_4_ * auVar102._12_4_;
              auVar98 = vsubps_avx(local_aa0._0_16_,auVar171);
              fVar201 = auVar98._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar201;
              auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar105 = vmulss_avx512f(auVar104,ZEXT416(0x3fc00000));
              auVar106 = vmulss_avx512f(auVar98,ZEXT416(0xbf000000));
              if (fVar201 < 0.0) {
                local_8e0._0_4_ = auVar106._0_4_;
                local_8f0 = fVar199;
                fStack_8ec = fVar199;
                fStack_8e8 = fVar199;
                fStack_8e4 = fVar199;
                local_8d0 = auVar104;
                fVar201 = sqrtf(fVar201);
                auVar106 = ZEXT416((uint)local_8e0._0_4_);
                auVar105 = ZEXT416(auVar105._0_4_);
                auVar103 = ZEXT416(auVar103._0_4_);
                auVar97 = ZEXT416((uint)local_940._0_4_);
                auVar104 = local_8d0;
                fVar199 = local_8f0;
                fVar226 = fStack_8ec;
                fVar204 = fStack_8e8;
                fVar206 = fStack_8e4;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                fVar201 = auVar98._0_4_;
                fVar226 = fVar199;
                fVar204 = fVar199;
                fVar206 = fVar199;
              }
              auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_760,local_780._0_16_)
              ;
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,_local_760);
              fVar186 = auVar98._0_4_ * 6.0;
              fVar198 = local_780._0_4_ * 6.0;
              auVar229._0_4_ = fVar198 * (float)local_860._0_4_;
              auVar229._4_4_ = fVar198 * (float)local_860._4_4_;
              auVar229._8_4_ = fVar198 * fStack_858;
              auVar229._12_4_ = fVar198 * fStack_854;
              auVar211._4_4_ = fVar186;
              auVar211._0_4_ = fVar186;
              auVar211._8_4_ = fVar186;
              auVar211._12_4_ = fVar186;
              auVar98 = vfmadd132ps_fma(auVar211,auVar229,local_820._0_16_);
              fVar186 = auVar109._0_4_ * 6.0;
              auVar188._4_4_ = fVar186;
              auVar188._0_4_ = fVar186;
              auVar188._8_4_ = fVar186;
              auVar188._12_4_ = fVar186;
              auVar98 = vfmadd132ps_fma(auVar188,auVar98,local_840._0_16_);
              fVar186 = local_760._0_4_ * 6.0;
              auVar212._4_4_ = fVar186;
              auVar212._0_4_ = fVar186;
              auVar212._8_4_ = fVar186;
              auVar212._12_4_ = fVar186;
              auVar98 = vfmadd132ps_fma(auVar212,auVar98,local_800._0_16_);
              auVar189._0_4_ = auVar98._0_4_ * (float)local_7a0._0_4_;
              auVar189._4_4_ = auVar98._4_4_ * (float)local_7a0._0_4_;
              auVar189._8_4_ = auVar98._8_4_ * (float)local_7a0._0_4_;
              auVar189._12_4_ = auVar98._12_4_ * (float)local_7a0._0_4_;
              auVar98 = vdpps_avx(auVar101,auVar98,0x7f);
              fVar186 = auVar98._0_4_;
              auVar213._0_4_ = auVar101._0_4_ * fVar186;
              auVar213._4_4_ = auVar101._4_4_ * fVar186;
              auVar213._8_4_ = auVar101._8_4_ * fVar186;
              auVar213._12_4_ = auVar101._12_4_ * fVar186;
              auVar98 = vsubps_avx(auVar189,auVar213);
              fVar186 = (float)local_7e0._0_4_ * (float)local_7c0._0_4_;
              auVar109 = vmaxss_avx(ZEXT416((uint)fVar197),
                                    ZEXT416((uint)(local_8c0._0_4_ * fVar185 * 1.9073486e-06)));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar107 = vxorps_avx512vl(auVar101,auVar29);
              auVar214._0_4_ = fVar199 * auVar98._0_4_ * fVar186;
              auVar214._4_4_ = fVar226 * auVar98._4_4_ * fVar186;
              auVar214._8_4_ = fVar204 * auVar98._8_4_ * fVar186;
              auVar214._12_4_ = fVar206 * auVar98._12_4_ * fVar186;
              auVar274 = ZEXT1664(_local_9e0);
              auVar98 = vdpps_avx(auVar107,_local_9e0,0x7f);
              auVar108 = vdivss_avx512f(ZEXT416((uint)fVar197),auVar103);
              auVar103 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar197),auVar109);
              auVar97 = vdpps_avx(auVar100,auVar214,0x7f);
              auVar108 = vfmadd213ss_fma(ZEXT416((uint)(fVar184 + 1.0)),auVar108,auVar103);
              fVar199 = auVar98._0_4_ + auVar97._0_4_;
              auVar97 = vdpps_avx(local_9b0,_local_9e0,0x7f);
              auVar103 = vdpps_avx(auVar100,auVar107,0x7f);
              auVar98 = vmulss_avx512f(auVar106,auVar104);
              auVar104 = vmulss_avx512f(auVar104,auVar104);
              auVar106 = vaddss_avx512f(auVar105,ZEXT416((uint)(auVar98._0_4_ * auVar104._0_4_)));
              auVar98 = vdpps_avx(auVar100,local_9b0,0x7f);
              auVar105 = vfnmadd231ss_fma(auVar103,auVar102,ZEXT416((uint)fVar199));
              auVar98 = vfnmadd231ss_fma(auVar98,auVar102,auVar97);
              auVar103 = vpermilps_avx(local_740._0_16_,0xff);
              fVar201 = fVar201 - auVar103._0_4_;
              auVar104 = vshufps_avx(auVar101,auVar101,0xff);
              auVar103 = vfmsub213ss_fma(auVar105,auVar106,auVar104);
              auVar259._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar98 = ZEXT416((uint)(auVar98._0_4_ * auVar106._0_4_));
              auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar199),auVar98);
              auVar103 = vinsertps_avx(auVar259,auVar98,0x1c);
              auVar250._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar250._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar250._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar98 = vinsertps_avx(ZEXT416((uint)fVar199),auVar250,0x10);
              auVar230._0_4_ = auVar105._0_4_;
              auVar230._4_4_ = auVar230._0_4_;
              auVar230._8_4_ = auVar230._0_4_;
              auVar230._12_4_ = auVar230._0_4_;
              auVar97 = vdivps_avx(auVar103,auVar230);
              auVar103 = vdivps_avx(auVar98,auVar230);
              auVar98 = vbroadcastss_avx512vl(auVar102);
              auVar231._0_4_ = auVar98._0_4_ * auVar97._0_4_ + fVar201 * auVar103._0_4_;
              auVar231._4_4_ = auVar98._4_4_ * auVar97._4_4_ + fVar201 * auVar103._4_4_;
              auVar231._8_4_ = auVar98._8_4_ * auVar97._8_4_ + fVar201 * auVar103._8_4_;
              auVar231._12_4_ = auVar98._12_4_ * auVar97._12_4_ + fVar201 * auVar103._12_4_;
              auVar97 = vsubps_avx(local_8c0._0_16_,auVar231);
              auVar182 = ZEXT1664(auVar97);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar102,auVar30);
            } while (auVar108._0_4_ <= auVar103._0_4_);
            auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ + auVar109._0_4_)),local_900,
                                       ZEXT416(0x36000000));
            auVar31._8_4_ = 0x7fffffff;
            auVar31._0_8_ = 0x7fffffff7fffffff;
            auVar31._12_4_ = 0x7fffffff;
            auVar102 = vandps_avx512vl(ZEXT416((uint)fVar201),auVar31);
          } while (auVar103._0_4_ <= auVar102._0_4_);
          fVar185 = auVar97._0_4_ + (float)local_910._0_4_;
          if ((fVar6 <= fVar185) &&
             (fVar197 = pre->ray_space[9].vy.field_0.m128[(long)ray], fVar185 <= fVar197)) {
            auVar97 = vmovshdup_avx(auVar97);
            fVar199 = auVar97._0_4_;
            if ((0.0 <= fVar199) && (fVar199 <= 1.0)) {
              auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_aa0._0_4_));
              fVar201 = auVar97._0_4_;
              lVar89 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar86 * 8);
              if ((*(uint *)(lVar89 + 0x34) & (uint)pre->ray_space[10].vz.field_0.m128[(long)ray])
                  != 0) {
                fVar201 = fVar201 * 1.5 + local_aa0._0_4_ * -0.5 * fVar201 * fVar201 * fVar201;
                auVar232._0_4_ = auVar100._0_4_ * fVar201;
                auVar232._4_4_ = auVar100._4_4_ * fVar201;
                auVar232._8_4_ = auVar100._8_4_ * fVar201;
                auVar232._12_4_ = auVar100._12_4_ * fVar201;
                auVar103 = vfmadd213ps_fma(auVar104,auVar232,auVar101);
                auVar97 = vshufps_avx(auVar232,auVar232,0xc9);
                auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar233._0_4_ = auVar232._0_4_ * auVar100._0_4_;
                auVar233._4_4_ = auVar232._4_4_ * auVar100._4_4_;
                auVar233._8_4_ = auVar232._8_4_ * auVar100._8_4_;
                auVar233._12_4_ = auVar232._12_4_ * auVar100._12_4_;
                auVar101 = vfmsub231ps_fma(auVar233,auVar101,auVar97);
                auVar97 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar100 = vshufps_avx(auVar103,auVar103,0xc9);
                auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                auVar172._0_4_ = auVar103._0_4_ * auVar101._0_4_;
                auVar172._4_4_ = auVar103._4_4_ * auVar101._4_4_;
                auVar172._8_4_ = auVar103._8_4_ * auVar101._8_4_;
                auVar172._12_4_ = auVar103._12_4_ * auVar101._12_4_;
                auVar97 = vfmsub231ps_fma(auVar172,auVar97,auVar100);
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar89 + 0x40) == 0))
                {
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                  fVar185 = (float)vextractps_avx(auVar97,1);
                  pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar185;
                  uVar169 = vextractps_avx(auVar97,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar169;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar97._0_4_;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar199;
                  pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[4].vx.field_0.m128[(long)ray] = (float)local_a68;
                  pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar168;
                  pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[8].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  puVar7 = *(uint **)(k + 8);
                  auVar258 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar258,auVar182);
                  local_400 = vpermps_avx512f(auVar258,ZEXT1664(auVar97));
                  auVar182 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar182,ZEXT1664(auVar97));
                  local_380 = vbroadcastss_avx512f(auVar97);
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar182 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar182);
                  auVar114 = vpcmpeqd_avx2(auVar182._0_32_,auVar182._0_32_);
                  local_a80[3] = auVar114;
                  local_a80[2] = auVar114;
                  local_a80[1] = auVar114;
                  *local_a80 = auVar114;
                  local_240 = vbroadcastss_avx512f(ZEXT416(*puVar7));
                  local_200 = vbroadcastss_avx512f(ZEXT416(puVar7[1]));
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                  auVar182 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar182);
                  local_ad0 = local_700;
                  local_ac8 = *(undefined8 *)(lVar89 + 0x18);
                  local_ac0 = *(undefined8 *)(k + 8);
                  local_ab0 = (int *)local_400;
                  local_aa8 = 0x10;
                  local_8c0._0_4_ = fVar197;
                  local_ab8 = pre;
                  if (*(code **)(lVar89 + 0x40) != (code *)0x0) {
                    auVar274 = ZEXT1664(_local_9e0);
                    (**(code **)(lVar89 + 0x40))(&local_ad0);
                    auVar182 = vmovdqa64_avx512f(local_700);
                    fVar197 = (float)local_8c0._0_4_;
                  }
                  uVar23 = vptestmd_avx512f(auVar182,auVar182);
                  if ((short)uVar23 != 0) {
                    pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar8 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar89 + 0x3e) & 0x40) != 0)))) {
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      (*pcVar8)(&local_ad0);
                      auVar182 = vmovdqa64_avx512f(local_700);
                      fVar197 = (float)local_8c0._0_4_;
                    }
                    uVar95 = vptestmd_avx512f(auVar182,auVar182);
                    if ((short)uVar95 != 0) {
                      iVar3 = local_ab0[1];
                      iVar4 = local_ab0[2];
                      iVar1 = local_ab0[3];
                      iVar52 = local_ab0[4];
                      iVar53 = local_ab0[5];
                      iVar54 = local_ab0[6];
                      iVar55 = local_ab0[7];
                      iVar56 = local_ab0[8];
                      iVar57 = local_ab0[9];
                      iVar58 = local_ab0[10];
                      iVar59 = local_ab0[0xb];
                      iVar60 = local_ab0[0xc];
                      iVar61 = local_ab0[0xd];
                      iVar62 = local_ab0[0xe];
                      iVar63 = local_ab0[0xf];
                      pVVar5 = &local_ab8->ray_space[0xe].vz;
                      iVar64 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8->ray_space[0xf].vx.field_0;
                      iVar68 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8->ray_space[0xf].vy.field_0;
                      iVar72 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8->ray_space[0xf].vz.field_0;
                      iVar76 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 0xc);
                      bVar85 = (byte)uVar95;
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar84 = (byte)(uVar95 >> 8);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar85 & 1) * *local_ab0 |
                                  (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8->ray_space[0xe].vz.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8->ray_space[0xe].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8->ray_space[0xe].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8->ray_space[0xf].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8->ray_space[0xf].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8->ray_space[0xf].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8->ray_space[0xf].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8->ray_space[0xf].vy.field_0.m128[0] =
                           (float)((uint)(bVar84 & 1) * iVar56 | (uint)!(bool)(bVar84 & 1) * iVar71)
                      ;
                      local_ab8->ray_space[0xf].vy.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8->ray_space[0xf].vy.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8->ray_space[0xf].vy.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8->ray_space[0xf].vz.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8->ray_space[0xf].vz.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8->ray_space[0xf].vz.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8->ray_space[0xf].vz.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x11];
                      iVar4 = local_ab0[0x12];
                      iVar1 = local_ab0[0x13];
                      iVar52 = local_ab0[0x14];
                      iVar53 = local_ab0[0x15];
                      iVar54 = local_ab0[0x16];
                      iVar55 = local_ab0[0x17];
                      iVar56 = local_ab0[0x18];
                      iVar57 = local_ab0[0x19];
                      iVar58 = local_ab0[0x1a];
                      iVar59 = local_ab0[0x1b];
                      iVar60 = local_ab0[0x1c];
                      iVar61 = local_ab0[0x1d];
                      iVar62 = local_ab0[0x1e];
                      iVar63 = local_ab0[0x1f];
                      iVar64 = local_ab8[1].depth_scale.field_0.i[1];
                      iVar65 = local_ab8[1].depth_scale.field_0.i[2];
                      iVar66 = local_ab8[1].depth_scale.field_0.i[3];
                      iVar67 = local_ab8[1].depth_scale.field_0.i[4];
                      iVar68 = local_ab8[1].depth_scale.field_0.i[5];
                      iVar69 = local_ab8[1].depth_scale.field_0.i[6];
                      iVar70 = local_ab8[1].depth_scale.field_0.i[7];
                      iVar71 = local_ab8[1].depth_scale.field_0.i[8];
                      iVar72 = local_ab8[1].depth_scale.field_0.i[9];
                      iVar73 = local_ab8[1].depth_scale.field_0.i[10];
                      iVar74 = local_ab8[1].depth_scale.field_0.i[0xb];
                      iVar75 = local_ab8[1].depth_scale.field_0.i[0xc];
                      iVar76 = local_ab8[1].depth_scale.field_0.i[0xd];
                      iVar77 = local_ab8[1].depth_scale.field_0.i[0xe];
                      iVar78 = local_ab8[1].depth_scale.field_0.i[0xf];
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      local_ab8[1].depth_scale.field_0.i[0] =
                           (uint)(bVar85 & 1) * local_ab0[0x10] |
                           (uint)!(bool)(bVar85 & 1) * local_ab8[1].depth_scale.field_0.i[0];
                      local_ab8[1].depth_scale.field_0.i[1] =
                           (uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64;
                      local_ab8[1].depth_scale.field_0.i[2] =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65;
                      local_ab8[1].depth_scale.field_0.i[3] =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66;
                      local_ab8[1].depth_scale.field_0.i[4] =
                           (uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67;
                      local_ab8[1].depth_scale.field_0.i[5] =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68;
                      local_ab8[1].depth_scale.field_0.i[6] =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69;
                      local_ab8[1].depth_scale.field_0.i[7] =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70;
                      local_ab8[1].depth_scale.field_0.i[8] =
                           (uint)(bVar84 & 1) * iVar56 | (uint)!(bool)(bVar84 & 1) * iVar71;
                      local_ab8[1].depth_scale.field_0.i[9] =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72;
                      local_ab8[1].depth_scale.field_0.i[10] =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73;
                      local_ab8[1].depth_scale.field_0.i[0xb] =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74;
                      local_ab8[1].depth_scale.field_0.i[0xc] =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75;
                      local_ab8[1].depth_scale.field_0.i[0xd] =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76;
                      local_ab8[1].depth_scale.field_0.i[0xe] =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77;
                      local_ab8[1].depth_scale.field_0.i[0xf] =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78;
                      iVar3 = local_ab0[0x21];
                      iVar4 = local_ab0[0x22];
                      iVar1 = local_ab0[0x23];
                      iVar52 = local_ab0[0x24];
                      iVar53 = local_ab0[0x25];
                      iVar54 = local_ab0[0x26];
                      iVar55 = local_ab0[0x27];
                      iVar56 = local_ab0[0x28];
                      iVar57 = local_ab0[0x29];
                      iVar58 = local_ab0[0x2a];
                      iVar59 = local_ab0[0x2b];
                      iVar60 = local_ab0[0x2c];
                      iVar61 = local_ab0[0x2d];
                      iVar62 = local_ab0[0x2e];
                      iVar63 = local_ab0[0x2f];
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[0].vy.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[0].vz.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[1].vx.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      local_ab8[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar85 & 1) * local_ab0[0x20] |
                                  (uint)!(bool)(bVar85 & 1) *
                                  *(int *)&local_ab8[1].ray_space[0].vx.field_0);
                      local_ab8[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[0].vy.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[0].vz.field_0.m128[0] =
                           (float)((uint)(bVar84 & 1) * iVar56 | (uint)!(bool)(bVar84 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[1].vx.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[1].vx.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[1].vx.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[1].vx.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x31];
                      iVar4 = local_ab0[0x32];
                      iVar1 = local_ab0[0x33];
                      iVar52 = local_ab0[0x34];
                      iVar53 = local_ab0[0x35];
                      iVar54 = local_ab0[0x36];
                      iVar55 = local_ab0[0x37];
                      iVar56 = local_ab0[0x38];
                      iVar57 = local_ab0[0x39];
                      iVar58 = local_ab0[0x3a];
                      iVar59 = local_ab0[0x3b];
                      iVar60 = local_ab0[0x3c];
                      iVar61 = local_ab0[0x3d];
                      iVar62 = local_ab0[0x3e];
                      iVar63 = local_ab0[0x3f];
                      pVVar5 = &local_ab8[1].ray_space[1].vy;
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[1].vz.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[2].vx.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[2].vy.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar85 & 1) * local_ab0[0x30] |
                                  (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8[1].ray_space[1].vy.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[1].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[1].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[1].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[1].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[1].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[1].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[2].vx.field_0.m128[0] =
                           (float)((uint)(bVar84 & 1) * iVar56 | (uint)!(bool)(bVar84 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[2].vx.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[2].vx.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[2].vx.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[2].vy.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[2].vy.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[2].vy.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[2].vy.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x41];
                      iVar4 = local_ab0[0x42];
                      iVar1 = local_ab0[0x43];
                      iVar52 = local_ab0[0x44];
                      iVar53 = local_ab0[0x45];
                      iVar54 = local_ab0[0x46];
                      iVar55 = local_ab0[0x47];
                      iVar56 = local_ab0[0x48];
                      iVar57 = local_ab0[0x49];
                      iVar58 = local_ab0[0x4a];
                      iVar59 = local_ab0[0x4b];
                      iVar60 = local_ab0[0x4c];
                      iVar61 = local_ab0[0x4d];
                      iVar62 = local_ab0[0x4e];
                      iVar63 = local_ab0[0x4f];
                      pVVar5 = &local_ab8[1].ray_space[2].vz;
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[3].vx.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[3].vy.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[3].vz.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar85 & 1) * local_ab0[0x40] |
                                  (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8[1].ray_space[2].vz.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[2].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[2].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[3].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[3].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[3].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[3].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[3].vy.field_0.m128[0] =
                           (float)((uint)(bVar84 & 1) * iVar56 | (uint)!(bool)(bVar84 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[3].vy.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[3].vy.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[3].vy.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[3].vz.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x50));
                      auVar182 = vmovdqu32_avx512f(auVar182);
                      *(undefined1 (*) [64])(local_ab8[1].ray_space + 4) = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x60));
                      auVar182 = vmovdqu32_avx512f(auVar182);
                      *(undefined1 (*) [64])&local_ab8[1].ray_space[5].vy = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x70));
                      auVar182 = vmovdqa32_avx512f(auVar182);
                      *(undefined1 (*) [64])&local_ab8[1].ray_space[6].vz = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x80));
                      auVar182 = vmovdqa32_avx512f(auVar182);
                      *(undefined1 (*) [64])(local_ab8[1].ray_space + 8) = auVar182;
                      goto LAB_01a151c6;
                    }
                  }
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar197;
                }
              }
            }
          }
LAB_01a151c6:
          uVar169 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
          auVar253._4_4_ = uVar169;
          auVar253._0_4_ = uVar169;
          auVar253._8_4_ = uVar169;
          auVar253._12_4_ = uVar169;
          auVar253._16_4_ = uVar169;
          auVar253._20_4_ = uVar169;
          auVar253._24_4_ = uVar169;
          auVar253._28_4_ = uVar169;
          auVar182 = ZEXT3264(auVar253);
          auVar79._4_4_ = fStack_69c;
          auVar79._0_4_ = local_6a0;
          auVar79._8_4_ = fStack_698;
          auVar79._12_4_ = fStack_694;
          auVar79._16_4_ = fStack_690;
          auVar79._20_4_ = fStack_68c;
          auVar79._24_4_ = fStack_688;
          auVar79._28_4_ = fStack_684;
          uVar23 = vcmpps_avx512vl(auVar253,auVar79,0xd);
          auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar275 = ZEXT3264(local_980);
          auVar276 = ZEXT3264(local_9a0);
        }
        auVar179._0_4_ = (float)local_960._0_4_ + (float)local_6c0._0_4_;
        auVar179._4_4_ = (float)local_960._4_4_ + (float)local_6c0._4_4_;
        auVar179._8_4_ = fStack_958 + fStack_6b8;
        auVar179._12_4_ = fStack_954 + fStack_6b4;
        auVar179._16_4_ = fStack_950 + fStack_6b0;
        auVar179._20_4_ = fStack_94c + fStack_6ac;
        auVar179._24_4_ = fStack_948 + fStack_6a8;
        auVar179._28_4_ = fStack_944 + fStack_6a4;
        uVar169 = auVar182._0_4_;
        auVar195._4_4_ = uVar169;
        auVar195._0_4_ = uVar169;
        auVar195._8_4_ = uVar169;
        auVar195._12_4_ = uVar169;
        auVar195._16_4_ = uVar169;
        auVar195._20_4_ = uVar169;
        auVar195._24_4_ = uVar169;
        auVar195._28_4_ = uVar169;
        uVar23 = vcmpps_avx512vl(auVar179,auVar195,2);
        auVar180._8_4_ = 2;
        auVar180._0_8_ = 0x200000002;
        auVar180._12_4_ = 2;
        auVar180._16_4_ = 2;
        auVar180._20_4_ = 2;
        auVar180._24_4_ = 2;
        auVar180._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar114 = vpblendmd_avx512vl(auVar180,auVar40);
        local_6c0._0_4_ = (uint)(bVar83 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
        bVar92 = (bool)(bVar83 >> 1 & 1);
        local_6c0._4_4_ = (uint)bVar92 * auVar114._4_4_ | (uint)!bVar92 * 2;
        bVar92 = (bool)(bVar83 >> 2 & 1);
        fStack_6b8 = (float)((uint)bVar92 * auVar114._8_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar83 >> 3 & 1);
        fStack_6b4 = (float)((uint)bVar92 * auVar114._12_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar83 >> 4 & 1);
        fStack_6b0 = (float)((uint)bVar92 * auVar114._16_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar83 >> 5 & 1);
        fStack_6ac = (float)((uint)bVar92 * auVar114._20_4_ | (uint)!bVar92 * 2);
        bVar92 = (bool)(bVar83 >> 6 & 1);
        fStack_6a8 = (float)((uint)bVar92 * auVar114._24_4_ | (uint)!bVar92 * 2);
        fStack_6a4 = (float)((uint)(bVar83 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2)
        ;
        bVar82 = (byte)uVar25 & bVar82 & (byte)uVar23;
        uVar23 = vpcmpd_avx512vl(_local_6c0,local_660,2);
        local_720 = _local_620;
        local_6a0 = (float)local_960._0_4_ + (float)local_620._0_4_;
        fStack_69c = (float)local_960._4_4_ + (float)local_620._4_4_;
        fStack_698 = fStack_958 + fStack_618;
        fStack_694 = fStack_954 + fStack_614;
        fStack_690 = fStack_950 + fStack_610;
        fStack_68c = fStack_94c + fStack_60c;
        fStack_688 = fStack_948 + fStack_608;
        fStack_684 = fStack_944 + fStack_604;
        auVar266 = ZEXT3264(local_a40);
        auVar267 = ZEXT3264(local_a60);
        auVar263 = ZEXT3264(local_a00);
        auVar265 = ZEXT3264(local_a20);
        for (bVar90 = (byte)uVar23 & bVar82; bVar90 != 0;
            bVar90 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar90 & (byte)uVar23) {
          auVar181._8_4_ = 0x7f800000;
          auVar181._0_8_ = 0x7f8000007f800000;
          auVar181._12_4_ = 0x7f800000;
          auVar181._16_4_ = 0x7f800000;
          auVar181._20_4_ = 0x7f800000;
          auVar181._24_4_ = 0x7f800000;
          auVar181._28_4_ = 0x7f800000;
          auVar114 = vblendmps_avx512vl(auVar181,local_720);
          auVar160._0_4_ =
               (uint)(bVar90 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 1 & 1);
          auVar160._4_4_ = (uint)bVar92 * auVar114._4_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 2 & 1);
          auVar160._8_4_ = (uint)bVar92 * auVar114._8_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 3 & 1);
          auVar160._12_4_ = (uint)bVar92 * auVar114._12_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 4 & 1);
          auVar160._16_4_ = (uint)bVar92 * auVar114._16_4_ | (uint)!bVar92 * 0x7f800000;
          bVar92 = (bool)(bVar90 >> 5 & 1);
          auVar160._20_4_ = (uint)bVar92 * auVar114._20_4_ | (uint)!bVar92 * 0x7f800000;
          auVar160._24_4_ =
               (uint)(bVar90 >> 6) * auVar114._24_4_ | (uint)!(bool)(bVar90 >> 6) * 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar114 = vshufps_avx(auVar160,auVar160,0xb1);
          auVar114 = vminps_avx(auVar160,auVar114);
          auVar125 = vshufpd_avx(auVar114,auVar114,5);
          auVar114 = vminps_avx(auVar114,auVar125);
          auVar125 = vpermpd_avx2(auVar114,0x4e);
          auVar114 = vminps_avx(auVar114,auVar125);
          uVar23 = vcmpps_avx512vl(auVar160,auVar114,0);
          bVar85 = (byte)uVar23 & bVar90;
          bVar83 = bVar90;
          if (bVar85 != 0) {
            bVar83 = bVar85;
          }
          iVar2 = 0;
          for (uVar96 = (uint)bVar83; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar96 = *(uint *)(local_500 + (uint)(iVar2 << 2));
          fVar185 = auVar99._0_4_;
          auVar97 = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
          if ((float)local_9c0._0_4_ < 0.0) {
            local_aa0._0_16_ = ZEXT416(*(uint *)(local_600 + (uint)(iVar2 << 2)));
            auVar274 = ZEXT1664(auVar274._0_16_);
            fVar185 = sqrtf((float)local_9c0._0_4_);
            auVar265 = ZEXT3264(local_a20);
            auVar263 = ZEXT3264(local_a00);
            auVar267 = ZEXT3264(local_a60);
            auVar266 = ZEXT3264(local_a40);
            auVar97 = local_aa0._0_16_;
          }
          auVar101 = vminps_avx(local_800._0_16_,local_840._0_16_);
          auVar100 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
          auVar103 = vminps_avx(local_820._0_16_,local_860._0_16_);
          auVar102 = vminps_avx(auVar101,auVar103);
          auVar101 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
          auVar103 = vmaxps_avx(auVar100,auVar101);
          auVar234._8_4_ = 0x7fffffff;
          auVar234._0_8_ = 0x7fffffff7fffffff;
          auVar234._12_4_ = 0x7fffffff;
          auVar100 = vandps_avx(auVar102,auVar234);
          auVar101 = vandps_avx(auVar103,auVar234);
          auVar100 = vmaxps_avx(auVar100,auVar101);
          auVar101 = vmovshdup_avx(auVar100);
          auVar101 = vmaxss_avx(auVar101,auVar100);
          auVar100 = vshufpd_avx(auVar100,auVar100,1);
          auVar100 = vmaxss_avx(auVar100,auVar101);
          fVar197 = auVar100._0_4_ * 1.9073486e-06;
          local_900 = vshufps_avx(auVar103,auVar103,0xff);
          auVar97 = vinsertps_avx(auVar97,ZEXT416(uVar96),0x10);
          auVar182 = ZEXT1664(auVar97);
          lVar89 = 5;
          do {
            do {
              bVar92 = lVar89 == 0;
              lVar89 = lVar89 + -1;
              if (bVar92) goto LAB_01a15ea3;
              uVar169 = auVar182._0_4_;
              auVar173._4_4_ = uVar169;
              auVar173._0_4_ = uVar169;
              auVar173._8_4_ = uVar169;
              auVar173._12_4_ = uVar169;
              auVar100 = vfmadd132ps_fma(auVar173,ZEXT816(0) << 0x40,local_9b0);
              auVar101 = auVar182._0_16_;
              auVar97 = vmovshdup_avx(auVar101);
              local_780._0_16_ = auVar97;
              fVar204 = 1.0 - auVar97._0_4_;
              auVar97 = vshufps_avx(auVar101,auVar101,0x55);
              fVar199 = auVar97._0_4_;
              auVar215._0_4_ = local_840._0_4_ * fVar199;
              fVar201 = auVar97._4_4_;
              auVar215._4_4_ = local_840._4_4_ * fVar201;
              fVar184 = auVar97._8_4_;
              auVar215._8_4_ = local_840._8_4_ * fVar184;
              fVar226 = auVar97._12_4_;
              auVar215._12_4_ = local_840._12_4_ * fVar226;
              _local_760 = ZEXT416((uint)fVar204);
              auVar235._4_4_ = fVar204;
              auVar235._0_4_ = fVar204;
              auVar235._8_4_ = fVar204;
              auVar235._12_4_ = fVar204;
              auVar97 = vfmadd231ps_fma(auVar215,auVar235,local_800._0_16_);
              auVar245._0_4_ = local_820._0_4_ * fVar199;
              auVar245._4_4_ = local_820._4_4_ * fVar201;
              auVar245._8_4_ = local_820._8_4_ * fVar184;
              auVar245._12_4_ = local_820._12_4_ * fVar226;
              auVar101 = vfmadd231ps_fma(auVar245,auVar235,local_840._0_16_);
              auVar251._0_4_ = fVar199 * (float)local_860._0_4_;
              auVar251._4_4_ = fVar201 * (float)local_860._4_4_;
              auVar251._8_4_ = fVar184 * fStack_858;
              auVar251._12_4_ = fVar226 * fStack_854;
              auVar103 = vfmadd231ps_fma(auVar251,auVar235,local_820._0_16_);
              auVar256._0_4_ = fVar199 * auVar101._0_4_;
              auVar256._4_4_ = fVar201 * auVar101._4_4_;
              auVar256._8_4_ = fVar184 * auVar101._8_4_;
              auVar256._12_4_ = fVar226 * auVar101._12_4_;
              auVar97 = vfmadd231ps_fma(auVar256,auVar235,auVar97);
              auVar216._0_4_ = fVar199 * auVar103._0_4_;
              auVar216._4_4_ = fVar201 * auVar103._4_4_;
              auVar216._8_4_ = fVar184 * auVar103._8_4_;
              auVar216._12_4_ = fVar226 * auVar103._12_4_;
              auVar101 = vfmadd231ps_fma(auVar216,auVar235,auVar101);
              auVar246._0_4_ = fVar199 * auVar101._0_4_;
              auVar246._4_4_ = fVar201 * auVar101._4_4_;
              auVar246._8_4_ = fVar184 * auVar101._8_4_;
              auVar246._12_4_ = fVar226 * auVar101._12_4_;
              auVar103 = vfmadd231ps_fma(auVar246,auVar97,auVar235);
              auVar97 = vsubps_avx(auVar101,auVar97);
              auVar32._8_4_ = 0x40400000;
              auVar32._0_8_ = 0x4040000040400000;
              auVar32._12_4_ = 0x40400000;
              auVar101 = vmulps_avx512vl(auVar97,auVar32);
              local_740._0_16_ = auVar103;
              auVar100 = vsubps_avx(auVar100,auVar103);
              auVar97 = vdpps_avx(auVar100,auVar100,0x7f);
              local_aa0._0_16_ = auVar97;
              local_8c0 = auVar182;
              if (auVar97._0_4_ < 0.0) {
                auVar258._0_4_ = sqrtf(auVar97._0_4_);
                auVar258._4_60_ = extraout_var_01;
                auVar97 = auVar258._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
              }
              local_7a0._0_16_ = vdpps_avx(auVar101,auVar101,0x7f);
              fVar199 = local_7a0._0_4_;
              auVar217._4_12_ = ZEXT812(0) << 0x20;
              auVar217._0_4_ = fVar199;
              _local_9e0 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar217);
              fVar201 = local_9e0._0_4_;
              local_7c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar217);
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(local_7a0._0_16_,auVar33);
              auVar103 = vfnmadd213ss_fma(local_7c0._0_16_,local_7a0._0_16_,ZEXT416(0x40000000));
              local_7e0._0_4_ = auVar103._0_4_;
              local_940._0_4_ = auVar97._0_4_;
              if (fVar199 < auVar102._0_4_) {
                auVar274._0_4_ = sqrtf(fVar199);
                auVar274._4_60_ = extraout_var_02;
                auVar97 = ZEXT416((uint)local_940._0_4_);
                auVar103 = auVar274._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx512f(local_7a0._0_16_,local_7a0._0_16_);
              }
              fVar184 = local_9e0._0_4_;
              local_9e0._4_4_ = fVar201 * 1.5 + fVar199 * -0.5 * fVar184 * fVar184 * fVar184;
              local_9e0._0_4_ = local_9e0._4_4_;
              fStack_9d8 = (float)local_9e0._4_4_;
              fStack_9d4 = (float)local_9e0._4_4_;
              auVar273._0_4_ = auVar101._0_4_ * (float)local_9e0._4_4_;
              auVar273._4_4_ = auVar101._4_4_ * (float)local_9e0._4_4_;
              auVar273._8_4_ = auVar101._8_4_ * (float)local_9e0._4_4_;
              auVar273._12_4_ = auVar101._12_4_ * (float)local_9e0._4_4_;
              auVar102 = vdpps_avx(auVar100,auVar273,0x7f);
              auVar105 = vaddss_avx512f(auVar97,ZEXT416(0x3f800000));
              auVar174._0_4_ = auVar102._0_4_ * auVar102._0_4_;
              auVar174._4_4_ = auVar102._4_4_ * auVar102._4_4_;
              auVar174._8_4_ = auVar102._8_4_ * auVar102._8_4_;
              auVar174._12_4_ = auVar102._12_4_ * auVar102._12_4_;
              auVar98 = vsubps_avx(local_aa0._0_16_,auVar174);
              fVar199 = auVar98._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar199;
              auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar106 = vmulss_avx512f(auVar104,ZEXT416(0x3fc00000));
              auVar109 = vmulss_avx512f(auVar98,ZEXT416(0xbf000000));
              uVar94 = fVar199 == 0.0;
              uVar93 = fVar199 < 0.0;
              if ((bool)uVar93) {
                local_8f0 = auVar109._0_4_;
                local_8e0 = auVar273;
                local_8d0 = auVar104;
                fVar199 = sqrtf(fVar199);
                auVar109 = ZEXT416((uint)local_8f0);
                auVar106 = ZEXT416(auVar106._0_4_);
                auVar103 = ZEXT416(auVar103._0_4_);
                auVar97 = ZEXT416((uint)local_940._0_4_);
                auVar105 = ZEXT416(auVar105._0_4_);
                auVar273 = local_8e0;
                auVar104 = local_8d0;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                fVar199 = auVar98._0_4_;
              }
              auVar274 = ZEXT1664(auVar273);
              auVar266 = ZEXT3264(local_a40);
              auVar267 = ZEXT3264(local_a60);
              auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_760,local_780._0_16_)
              ;
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,_local_760);
              fVar201 = auVar98._0_4_ * 6.0;
              fVar184 = local_780._0_4_ * 6.0;
              auVar236._0_4_ = fVar184 * (float)local_860._0_4_;
              auVar236._4_4_ = fVar184 * (float)local_860._4_4_;
              auVar236._8_4_ = fVar184 * fStack_858;
              auVar236._12_4_ = fVar184 * fStack_854;
              auVar218._4_4_ = fVar201;
              auVar218._0_4_ = fVar201;
              auVar218._8_4_ = fVar201;
              auVar218._12_4_ = fVar201;
              auVar98 = vfmadd132ps_fma(auVar218,auVar236,local_820._0_16_);
              fVar201 = auVar108._0_4_ * 6.0;
              auVar191._4_4_ = fVar201;
              auVar191._0_4_ = fVar201;
              auVar191._8_4_ = fVar201;
              auVar191._12_4_ = fVar201;
              auVar98 = vfmadd132ps_fma(auVar191,auVar98,local_840._0_16_);
              fVar201 = local_760._0_4_ * 6.0;
              auVar219._4_4_ = fVar201;
              auVar219._0_4_ = fVar201;
              auVar219._8_4_ = fVar201;
              auVar219._12_4_ = fVar201;
              auVar98 = vfmadd132ps_fma(auVar219,auVar98,local_800._0_16_);
              auVar192._0_4_ = auVar98._0_4_ * (float)local_7a0._0_4_;
              auVar192._4_4_ = auVar98._4_4_ * (float)local_7a0._0_4_;
              auVar192._8_4_ = auVar98._8_4_ * (float)local_7a0._0_4_;
              auVar192._12_4_ = auVar98._12_4_ * (float)local_7a0._0_4_;
              auVar98 = vdpps_avx(auVar101,auVar98,0x7f);
              fVar201 = auVar98._0_4_;
              auVar220._0_4_ = auVar101._0_4_ * fVar201;
              auVar220._4_4_ = auVar101._4_4_ * fVar201;
              auVar220._8_4_ = auVar101._8_4_ * fVar201;
              auVar220._12_4_ = auVar101._12_4_ * fVar201;
              auVar98 = vsubps_avx(auVar192,auVar220);
              fVar201 = (float)local_7e0._0_4_ * (float)local_7c0._0_4_;
              auVar108 = vmaxss_avx(ZEXT416((uint)fVar197),
                                    ZEXT416((uint)(local_8c0._0_4_ * fVar185 * 1.9073486e-06)));
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar107 = vxorps_avx512vl(auVar101,auVar34);
              auVar221._0_4_ = auVar98._0_4_ * fVar201 * (float)local_9e0._0_4_;
              auVar221._4_4_ = auVar98._4_4_ * fVar201 * (float)local_9e0._4_4_;
              auVar221._8_4_ = auVar98._8_4_ * fVar201 * fStack_9d8;
              auVar221._12_4_ = auVar98._12_4_ * fVar201 * fStack_9d4;
              auVar98 = vdpps_avx(auVar107,auVar273,0x7f);
              auVar110 = vdivss_avx512f(ZEXT416((uint)fVar197),auVar103);
              auVar103 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar197),auVar108);
              auVar97 = vdpps_avx(auVar100,auVar221,0x7f);
              vfmadd213ss_avx512f(auVar105,auVar110,auVar103);
              fVar201 = auVar98._0_4_ + auVar97._0_4_;
              auVar97 = vdpps_avx(local_9b0,auVar273,0x7f);
              auVar103 = vdpps_avx(auVar100,auVar107,0x7f);
              auVar98 = vmulss_avx512f(auVar109,auVar104);
              auVar104 = vmulss_avx512f(auVar104,auVar104);
              auVar106 = vaddss_avx512f(auVar106,ZEXT416((uint)(auVar98._0_4_ * auVar104._0_4_)));
              auVar98 = vdpps_avx(auVar100,local_9b0,0x7f);
              auVar105 = vfnmadd231ss_fma(auVar103,auVar102,ZEXT416((uint)fVar201));
              auVar98 = vfnmadd231ss_fma(auVar98,auVar102,auVar97);
              auVar103 = vpermilps_avx(local_740._0_16_,0xff);
              fVar199 = fVar199 - auVar103._0_4_;
              auVar104 = vshufps_avx(auVar101,auVar101,0xff);
              auVar103 = vfmsub213ss_fma(auVar105,auVar106,auVar104);
              auVar260._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar260._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar260._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar98 = ZEXT416((uint)(auVar98._0_4_ * auVar106._0_4_));
              auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar201),auVar98);
              auVar103 = vinsertps_avx(auVar260,auVar98,0x1c);
              auVar252._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar252._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar252._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar98 = vinsertps_avx(ZEXT416((uint)fVar201),auVar252,0x10);
              auVar237._0_4_ = auVar105._0_4_;
              auVar237._4_4_ = auVar237._0_4_;
              auVar237._8_4_ = auVar237._0_4_;
              auVar237._12_4_ = auVar237._0_4_;
              auVar97 = vdivps_avx(auVar103,auVar237);
              auVar103 = vdivps_avx(auVar98,auVar237);
              auVar98 = vbroadcastss_avx512vl(auVar102);
              auVar238._0_4_ = auVar98._0_4_ * auVar97._0_4_ + fVar199 * auVar103._0_4_;
              auVar238._4_4_ = auVar98._4_4_ * auVar97._4_4_ + fVar199 * auVar103._4_4_;
              auVar238._8_4_ = auVar98._8_4_ * auVar97._8_4_ + fVar199 * auVar103._8_4_;
              auVar238._12_4_ = auVar98._12_4_ * auVar97._12_4_ + fVar199 * auVar103._12_4_;
              auVar97 = vsubps_avx(local_8c0._0_16_,auVar238);
              auVar182 = ZEXT1664(auVar97);
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar102,auVar35);
              auVar103 = vucomiss_avx512f(auVar103);
              auVar263 = ZEXT3264(local_a00);
              auVar265 = ZEXT3264(local_a20);
            } while ((bool)uVar93 || (bool)uVar94);
            auVar103 = vaddss_avx512f(auVar108,auVar103);
            auVar103 = vfmadd231ss_fma(auVar103,local_900,ZEXT416(0x36000000));
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar102 = vandps_avx512vl(ZEXT416((uint)fVar199),auVar36);
          } while (auVar103._0_4_ <= auVar102._0_4_);
          fVar185 = auVar97._0_4_ + (float)local_910._0_4_;
          if ((fVar6 <= fVar185) &&
             (fVar197 = pre->ray_space[9].vy.field_0.m128[(long)ray], fVar185 <= fVar197)) {
            auVar97 = vmovshdup_avx(auVar97);
            fVar199 = auVar97._0_4_;
            if ((0.0 <= fVar199) && (fVar199 <= 1.0)) {
              auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_aa0._0_4_));
              fVar201 = auVar97._0_4_;
              lVar89 = *(long *)(*(long *)(*(long *)k + 0x1e8) + uVar86 * 8);
              if ((*(uint *)(lVar89 + 0x34) & (uint)pre->ray_space[10].vz.field_0.m128[(long)ray])
                  != 0) {
                fVar201 = fVar201 * 1.5 +
                          (float)local_aa0._0_4_ * -0.5 * fVar201 * fVar201 * fVar201;
                auVar239._0_4_ = auVar100._0_4_ * fVar201;
                auVar239._4_4_ = auVar100._4_4_ * fVar201;
                auVar239._8_4_ = auVar100._8_4_ * fVar201;
                auVar239._12_4_ = auVar100._12_4_ * fVar201;
                auVar103 = vfmadd213ps_fma(auVar104,auVar239,auVar101);
                auVar97 = vshufps_avx(auVar239,auVar239,0xc9);
                auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar240._0_4_ = auVar239._0_4_ * auVar100._0_4_;
                auVar240._4_4_ = auVar239._4_4_ * auVar100._4_4_;
                auVar240._8_4_ = auVar239._8_4_ * auVar100._8_4_;
                auVar240._12_4_ = auVar239._12_4_ * auVar100._12_4_;
                auVar101 = vfmsub231ps_fma(auVar240,auVar101,auVar97);
                auVar97 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar100 = vshufps_avx(auVar103,auVar103,0xc9);
                auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                auVar175._0_4_ = auVar103._0_4_ * auVar101._0_4_;
                auVar175._4_4_ = auVar103._4_4_ * auVar101._4_4_;
                auVar175._8_4_ = auVar103._8_4_ * auVar101._8_4_;
                auVar175._12_4_ = auVar103._12_4_ * auVar101._12_4_;
                auVar97 = vfmsub231ps_fma(auVar175,auVar97,auVar100);
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar89 + 0x40) == 0))
                {
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                  fVar185 = (float)vextractps_avx(auVar97,1);
                  pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar185;
                  uVar169 = vextractps_avx(auVar97,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar169;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar97._0_4_;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar199;
                  pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[4].vx.field_0.m128[(long)ray] = (float)local_a68;
                  pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar168;
                  pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[8].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  puVar7 = *(uint **)(k + 8);
                  auVar258 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar258,auVar182);
                  local_400 = vpermps_avx512f(auVar258,ZEXT1664(auVar97));
                  auVar182 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar182,ZEXT1664(auVar97));
                  local_380 = vbroadcastss_avx512f(auVar97);
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar182 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar182);
                  auVar114 = vpcmpeqd_avx2(auVar182._0_32_,auVar182._0_32_);
                  local_a80[3] = auVar114;
                  local_a80[2] = auVar114;
                  local_a80[1] = auVar114;
                  *local_a80 = auVar114;
                  local_240 = vbroadcastss_avx512f(ZEXT416(*puVar7));
                  local_200 = vbroadcastss_avx512f(ZEXT416(puVar7[1]));
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                  auVar182 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar182);
                  local_ad0 = local_700;
                  local_ac8 = *(undefined8 *)(lVar89 + 0x18);
                  local_ac0 = *(undefined8 *)(k + 8);
                  local_ab0 = (int *)local_400;
                  local_aa8 = 0x10;
                  local_8c0._0_4_ = fVar197;
                  local_ab8 = pre;
                  if (*(code **)(lVar89 + 0x40) != (code *)0x0) {
                    auVar274 = ZEXT1664(auVar273);
                    (**(code **)(lVar89 + 0x40))(&local_ad0);
                    auVar265 = ZEXT3264(local_a20);
                    auVar263 = ZEXT3264(local_a00);
                    auVar267 = ZEXT3264(local_a60);
                    auVar266 = ZEXT3264(local_a40);
                    auVar182 = vmovdqa64_avx512f(local_700);
                    fVar197 = (float)local_8c0._0_4_;
                  }
                  uVar23 = vptestmd_avx512f(auVar182,auVar182);
                  if ((short)uVar23 != 0) {
                    pcVar8 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar8 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar89 + 0x3e) & 0x40) != 0)))) {
                      auVar274 = ZEXT1664(auVar274._0_16_);
                      (*pcVar8)(&local_ad0);
                      auVar265 = ZEXT3264(local_a20);
                      auVar263 = ZEXT3264(local_a00);
                      auVar267 = ZEXT3264(local_a60);
                      auVar266 = ZEXT3264(local_a40);
                      auVar182 = vmovdqa64_avx512f(local_700);
                      fVar197 = (float)local_8c0._0_4_;
                    }
                    uVar95 = vptestmd_avx512f(auVar182,auVar182);
                    if ((short)uVar95 != 0) {
                      iVar3 = local_ab0[1];
                      iVar4 = local_ab0[2];
                      iVar1 = local_ab0[3];
                      iVar52 = local_ab0[4];
                      iVar53 = local_ab0[5];
                      iVar54 = local_ab0[6];
                      iVar55 = local_ab0[7];
                      iVar56 = local_ab0[8];
                      iVar57 = local_ab0[9];
                      iVar58 = local_ab0[10];
                      iVar59 = local_ab0[0xb];
                      iVar60 = local_ab0[0xc];
                      iVar61 = local_ab0[0xd];
                      iVar62 = local_ab0[0xe];
                      iVar63 = local_ab0[0xf];
                      pVVar5 = &local_ab8->ray_space[0xe].vz;
                      iVar64 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8->ray_space[0xf].vx.field_0;
                      iVar68 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8->ray_space[0xf].vy.field_0;
                      iVar72 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8->ray_space[0xf].vz.field_0;
                      iVar76 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 0xc);
                      bVar83 = (byte)uVar95;
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar85 = (byte)(uVar95 >> 8);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar83 & 1) * *local_ab0 |
                                  (uint)!(bool)(bVar83 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8->ray_space[0xe].vz.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8->ray_space[0xe].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8->ray_space[0xe].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8->ray_space[0xf].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8->ray_space[0xf].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8->ray_space[0xf].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8->ray_space[0xf].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8->ray_space[0xf].vy.field_0.m128[0] =
                           (float)((uint)(bVar85 & 1) * iVar56 | (uint)!(bool)(bVar85 & 1) * iVar71)
                      ;
                      local_ab8->ray_space[0xf].vy.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8->ray_space[0xf].vy.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8->ray_space[0xf].vy.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8->ray_space[0xf].vz.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8->ray_space[0xf].vz.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8->ray_space[0xf].vz.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8->ray_space[0xf].vz.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x11];
                      iVar4 = local_ab0[0x12];
                      iVar1 = local_ab0[0x13];
                      iVar52 = local_ab0[0x14];
                      iVar53 = local_ab0[0x15];
                      iVar54 = local_ab0[0x16];
                      iVar55 = local_ab0[0x17];
                      iVar56 = local_ab0[0x18];
                      iVar57 = local_ab0[0x19];
                      iVar58 = local_ab0[0x1a];
                      iVar59 = local_ab0[0x1b];
                      iVar60 = local_ab0[0x1c];
                      iVar61 = local_ab0[0x1d];
                      iVar62 = local_ab0[0x1e];
                      iVar63 = local_ab0[0x1f];
                      iVar64 = local_ab8[1].depth_scale.field_0.i[1];
                      iVar65 = local_ab8[1].depth_scale.field_0.i[2];
                      iVar66 = local_ab8[1].depth_scale.field_0.i[3];
                      iVar67 = local_ab8[1].depth_scale.field_0.i[4];
                      iVar68 = local_ab8[1].depth_scale.field_0.i[5];
                      iVar69 = local_ab8[1].depth_scale.field_0.i[6];
                      iVar70 = local_ab8[1].depth_scale.field_0.i[7];
                      iVar71 = local_ab8[1].depth_scale.field_0.i[8];
                      iVar72 = local_ab8[1].depth_scale.field_0.i[9];
                      iVar73 = local_ab8[1].depth_scale.field_0.i[10];
                      iVar74 = local_ab8[1].depth_scale.field_0.i[0xb];
                      iVar75 = local_ab8[1].depth_scale.field_0.i[0xc];
                      iVar76 = local_ab8[1].depth_scale.field_0.i[0xd];
                      iVar77 = local_ab8[1].depth_scale.field_0.i[0xe];
                      iVar78 = local_ab8[1].depth_scale.field_0.i[0xf];
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      local_ab8[1].depth_scale.field_0.i[0] =
                           (uint)(bVar83 & 1) * local_ab0[0x10] |
                           (uint)!(bool)(bVar83 & 1) * local_ab8[1].depth_scale.field_0.i[0];
                      local_ab8[1].depth_scale.field_0.i[1] =
                           (uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64;
                      local_ab8[1].depth_scale.field_0.i[2] =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65;
                      local_ab8[1].depth_scale.field_0.i[3] =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66;
                      local_ab8[1].depth_scale.field_0.i[4] =
                           (uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67;
                      local_ab8[1].depth_scale.field_0.i[5] =
                           (uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68;
                      local_ab8[1].depth_scale.field_0.i[6] =
                           (uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69;
                      local_ab8[1].depth_scale.field_0.i[7] =
                           (uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70;
                      local_ab8[1].depth_scale.field_0.i[8] =
                           (uint)(bVar85 & 1) * iVar56 | (uint)!(bool)(bVar85 & 1) * iVar71;
                      local_ab8[1].depth_scale.field_0.i[9] =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72;
                      local_ab8[1].depth_scale.field_0.i[10] =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73;
                      local_ab8[1].depth_scale.field_0.i[0xb] =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74;
                      local_ab8[1].depth_scale.field_0.i[0xc] =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75;
                      local_ab8[1].depth_scale.field_0.i[0xd] =
                           (uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76;
                      local_ab8[1].depth_scale.field_0.i[0xe] =
                           (uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77;
                      local_ab8[1].depth_scale.field_0.i[0xf] =
                           (uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78;
                      iVar3 = local_ab0[0x21];
                      iVar4 = local_ab0[0x22];
                      iVar1 = local_ab0[0x23];
                      iVar52 = local_ab0[0x24];
                      iVar53 = local_ab0[0x25];
                      iVar54 = local_ab0[0x26];
                      iVar55 = local_ab0[0x27];
                      iVar56 = local_ab0[0x28];
                      iVar57 = local_ab0[0x29];
                      iVar58 = local_ab0[0x2a];
                      iVar59 = local_ab0[0x2b];
                      iVar60 = local_ab0[0x2c];
                      iVar61 = local_ab0[0x2d];
                      iVar62 = local_ab0[0x2e];
                      iVar63 = local_ab0[0x2f];
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[0].vy.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[0].vz.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[1].vx.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      local_ab8[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar83 & 1) * local_ab0[0x20] |
                                  (uint)!(bool)(bVar83 & 1) *
                                  *(int *)&local_ab8[1].ray_space[0].vx.field_0);
                      local_ab8[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[0].vy.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[0].vz.field_0.m128[0] =
                           (float)((uint)(bVar85 & 1) * iVar56 | (uint)!(bool)(bVar85 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[1].vx.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[1].vx.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[1].vx.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[1].vx.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x31];
                      iVar4 = local_ab0[0x32];
                      iVar1 = local_ab0[0x33];
                      iVar52 = local_ab0[0x34];
                      iVar53 = local_ab0[0x35];
                      iVar54 = local_ab0[0x36];
                      iVar55 = local_ab0[0x37];
                      iVar56 = local_ab0[0x38];
                      iVar57 = local_ab0[0x39];
                      iVar58 = local_ab0[0x3a];
                      iVar59 = local_ab0[0x3b];
                      iVar60 = local_ab0[0x3c];
                      iVar61 = local_ab0[0x3d];
                      iVar62 = local_ab0[0x3e];
                      iVar63 = local_ab0[0x3f];
                      pVVar5 = &local_ab8[1].ray_space[1].vy;
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[1].vz.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[2].vx.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[2].vy.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar83 & 1) * local_ab0[0x30] |
                                  (uint)!(bool)(bVar83 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8[1].ray_space[1].vy.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[1].vy.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[1].vy.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[1].vz.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[1].vz.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[1].vz.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[1].vz.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[2].vx.field_0.m128[0] =
                           (float)((uint)(bVar85 & 1) * iVar56 | (uint)!(bool)(bVar85 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[2].vx.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[2].vx.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[2].vx.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[2].vy.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[2].vy.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[2].vy.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[2].vy.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      iVar3 = local_ab0[0x41];
                      iVar4 = local_ab0[0x42];
                      iVar1 = local_ab0[0x43];
                      iVar52 = local_ab0[0x44];
                      iVar53 = local_ab0[0x45];
                      iVar54 = local_ab0[0x46];
                      iVar55 = local_ab0[0x47];
                      iVar56 = local_ab0[0x48];
                      iVar57 = local_ab0[0x49];
                      iVar58 = local_ab0[0x4a];
                      iVar59 = local_ab0[0x4b];
                      iVar60 = local_ab0[0x4c];
                      iVar61 = local_ab0[0x4d];
                      iVar62 = local_ab0[0x4e];
                      iVar63 = local_ab0[0x4f];
                      pVVar5 = &local_ab8[1].ray_space[2].vz;
                      iVar64 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 4);
                      iVar65 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 8);
                      iVar66 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 0xc);
                      iVar67 = *(int *)&local_ab8[1].ray_space[3].vx.field_0;
                      iVar68 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 4);
                      iVar69 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 8);
                      iVar70 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 0xc);
                      iVar71 = *(int *)&local_ab8[1].ray_space[3].vy.field_0;
                      iVar72 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 4);
                      iVar73 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 8);
                      iVar74 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 0xc);
                      iVar75 = *(int *)&local_ab8[1].ray_space[3].vz.field_0;
                      iVar76 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 4);
                      iVar77 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 8);
                      iVar78 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 0xc);
                      bVar92 = (bool)((byte)(uVar95 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar95 >> 7) & 1);
                      bVar15 = (bool)((byte)(uVar95 >> 9) & 1);
                      bVar16 = (bool)((byte)(uVar95 >> 10) & 1);
                      bVar17 = (bool)((byte)(uVar95 >> 0xb) & 1);
                      bVar18 = (bool)((byte)(uVar95 >> 0xc) & 1);
                      bVar19 = (bool)((byte)(uVar95 >> 0xd) & 1);
                      bVar20 = (bool)((byte)(uVar95 >> 0xe) & 1);
                      bVar21 = SUB81(uVar95 >> 0xf,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar83 & 1) * local_ab0[0x40] |
                                  (uint)!(bool)(bVar83 & 1) * *(int *)&pVVar5->field_0);
                      local_ab8[1].ray_space[2].vz.field_0.m128[1] =
                           (float)((uint)bVar92 * iVar3 | (uint)!bVar92 * iVar64);
                      local_ab8[1].ray_space[2].vz.field_0.m128[2] =
                           (float)((uint)bVar9 * iVar4 | (uint)!bVar9 * iVar65);
                      local_ab8[1].ray_space[2].vz.field_0.m128[3] =
                           (float)((uint)bVar10 * iVar1 | (uint)!bVar10 * iVar66);
                      local_ab8[1].ray_space[3].vx.field_0.m128[0] =
                           (float)((uint)bVar11 * iVar52 | (uint)!bVar11 * iVar67);
                      local_ab8[1].ray_space[3].vx.field_0.m128[1] =
                           (float)((uint)bVar12 * iVar53 | (uint)!bVar12 * iVar68);
                      local_ab8[1].ray_space[3].vx.field_0.m128[2] =
                           (float)((uint)bVar13 * iVar54 | (uint)!bVar13 * iVar69);
                      local_ab8[1].ray_space[3].vx.field_0.m128[3] =
                           (float)((uint)bVar14 * iVar55 | (uint)!bVar14 * iVar70);
                      local_ab8[1].ray_space[3].vy.field_0.m128[0] =
                           (float)((uint)(bVar85 & 1) * iVar56 | (uint)!(bool)(bVar85 & 1) * iVar71)
                      ;
                      local_ab8[1].ray_space[3].vy.field_0.m128[1] =
                           (float)((uint)bVar15 * iVar57 | (uint)!bVar15 * iVar72);
                      local_ab8[1].ray_space[3].vy.field_0.m128[2] =
                           (float)((uint)bVar16 * iVar58 | (uint)!bVar16 * iVar73);
                      local_ab8[1].ray_space[3].vy.field_0.m128[3] =
                           (float)((uint)bVar17 * iVar59 | (uint)!bVar17 * iVar74);
                      local_ab8[1].ray_space[3].vz.field_0.m128[0] =
                           (float)((uint)bVar18 * iVar60 | (uint)!bVar18 * iVar75);
                      local_ab8[1].ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar19 * iVar61 | (uint)!bVar19 * iVar76);
                      local_ab8[1].ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar20 * iVar62 | (uint)!bVar20 * iVar77);
                      local_ab8[1].ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar21 * iVar63 | (uint)!bVar21 * iVar78);
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x50));
                      auVar182 = vmovdqu32_avx512f(auVar182);
                      *(undefined1 (*) [64])(local_ab8[1].ray_space + 4) = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x60));
                      auVar182 = vmovdqu32_avx512f(auVar182);
                      *(undefined1 (*) [64])&local_ab8[1].ray_space[5].vy = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x70));
                      auVar182 = vmovdqa32_avx512f(auVar182);
                      *(undefined1 (*) [64])&local_ab8[1].ray_space[6].vz = auVar182;
                      auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x80));
                      auVar182 = vmovdqa32_avx512f(auVar182);
                      *(undefined1 (*) [64])(local_ab8[1].ray_space + 8) = auVar182;
                      goto LAB_01a15ea3;
                    }
                  }
                  pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar197;
                }
              }
            }
          }
LAB_01a15ea3:
          uVar169 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
          auVar254._4_4_ = uVar169;
          auVar254._0_4_ = uVar169;
          auVar254._8_4_ = uVar169;
          auVar254._12_4_ = uVar169;
          auVar254._16_4_ = uVar169;
          auVar254._20_4_ = uVar169;
          auVar254._24_4_ = uVar169;
          auVar254._28_4_ = uVar169;
          auVar182 = ZEXT3264(auVar254);
          auVar80._4_4_ = fStack_69c;
          auVar80._0_4_ = local_6a0;
          auVar80._8_4_ = fStack_698;
          auVar80._12_4_ = fStack_694;
          auVar80._16_4_ = fStack_690;
          auVar80._20_4_ = fStack_68c;
          auVar80._24_4_ = fStack_688;
          auVar80._28_4_ = fStack_684;
          uVar23 = vcmpps_avx512vl(auVar254,auVar80,0xd);
          auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar275 = ZEXT3264(local_980);
          auVar276 = ZEXT3264(local_9a0);
        }
        uVar26 = vpcmpd_avx512vl(local_660,local_5e0,1);
        uVar25 = vpcmpd_avx512vl(local_660,_local_6c0,1);
        auVar196._0_4_ = (float)local_960._0_4_ + (float)local_540._0_4_;
        auVar196._4_4_ = (float)local_960._4_4_ + (float)local_540._4_4_;
        auVar196._8_4_ = fStack_958 + fStack_538;
        auVar196._12_4_ = fStack_954 + fStack_534;
        auVar196._16_4_ = fStack_950 + fStack_530;
        auVar196._20_4_ = fStack_94c + fStack_52c;
        auVar196._24_4_ = fStack_948 + fStack_528;
        auVar196._28_4_ = fStack_944 + fStack_524;
        uVar169 = auVar182._0_4_;
        auVar225._4_4_ = uVar169;
        auVar225._0_4_ = uVar169;
        auVar225._8_4_ = uVar169;
        auVar225._12_4_ = uVar169;
        auVar225._16_4_ = uVar169;
        auVar225._20_4_ = uVar169;
        auVar225._24_4_ = uVar169;
        auVar225._28_4_ = uVar169;
        uVar23 = vcmpps_avx512vl(auVar196,auVar225,2);
        bVar88 = bVar88 & (byte)uVar26 & (byte)uVar23;
        auVar242._0_4_ = (float)local_960._0_4_ + (float)local_620._0_4_;
        auVar242._4_4_ = (float)local_960._4_4_ + (float)local_620._4_4_;
        auVar242._8_4_ = fStack_958 + fStack_618;
        auVar242._12_4_ = fStack_954 + fStack_614;
        auVar242._16_4_ = fStack_950 + fStack_610;
        auVar242._20_4_ = fStack_94c + fStack_60c;
        auVar242._24_4_ = fStack_948 + fStack_608;
        auVar242._28_4_ = fStack_944 + fStack_604;
        uVar23 = vcmpps_avx512vl(auVar242,auVar225,2);
        bVar82 = bVar82 & (byte)uVar25 & (byte)uVar23 | bVar88;
        if (bVar82 != 0) {
          abStack_1a0[uVar87 * 0x60] = bVar82;
          bVar92 = (bool)(bVar88 >> 1 & 1);
          bVar9 = (bool)(bVar88 >> 2 & 1);
          bVar10 = (bool)(bVar88 >> 3 & 1);
          bVar11 = (bool)(bVar88 >> 4 & 1);
          bVar12 = (bool)(bVar88 >> 5 & 1);
          auStack_180[uVar87 * 0x18] =
               (uint)(bVar88 & 1) * local_540._0_4_ | (uint)!(bool)(bVar88 & 1) * local_620._0_4_;
          auStack_180[uVar87 * 0x18 + 1] =
               (uint)bVar92 * local_540._4_4_ | (uint)!bVar92 * local_620._4_4_;
          auStack_180[uVar87 * 0x18 + 2] =
               (uint)bVar9 * (int)fStack_538 | (uint)!bVar9 * (int)fStack_618;
          auStack_180[uVar87 * 0x18 + 3] =
               (uint)bVar10 * (int)fStack_534 | (uint)!bVar10 * (int)fStack_614;
          auStack_180[uVar87 * 0x18 + 4] =
               (uint)bVar11 * (int)fStack_530 | (uint)!bVar11 * (int)fStack_610;
          auStack_180[uVar87 * 0x18 + 5] =
               (uint)bVar12 * (int)fStack_52c | (uint)!bVar12 * (int)fStack_60c;
          auStack_180[uVar87 * 0x18 + 6] =
               (uint)(bVar88 >> 6) * (int)fStack_528 | (uint)!(bool)(bVar88 >> 6) * (int)fStack_608;
          (&fStack_164)[uVar87 * 0x18] = fStack_604;
          uVar95 = vmovlps_avx(local_670);
          (&uStack_160)[uVar87 * 0xc] = uVar95;
          aiStack_158[uVar87 * 0x18] = iVar91 + 1;
          uVar87 = (ulong)((int)uVar87 + 1);
        }
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar278 = ZEXT3264(auVar114);
        context = local_a78;
        fVar185 = (float)local_960._0_4_;
        fVar197 = (float)local_960._4_4_;
        fVar199 = fStack_958;
        fVar201 = fStack_954;
        fVar184 = fStack_950;
        fVar226 = fStack_94c;
        fVar204 = fStack_948;
        fVar206 = fStack_944;
      }
    }
    do {
      uVar96 = (uint)uVar87;
      uVar87 = (ulong)(uVar96 - 1);
      if (uVar96 == 0) {
        uVar169 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
        auVar42._4_4_ = uVar169;
        auVar42._0_4_ = uVar169;
        auVar42._8_4_ = uVar169;
        auVar42._12_4_ = uVar169;
        auVar42._16_4_ = uVar169;
        auVar42._20_4_ = uVar169;
        auVar42._24_4_ = uVar169;
        auVar42._28_4_ = uVar169;
        uVar23 = vcmpps_avx512vl(local_5c0,auVar42,2);
        local_a70 = (ulong)((uint)uVar23 & (uint)local_a70 - 1 & (uint)local_a70);
        goto LAB_01a13948;
      }
      auVar114 = *(undefined1 (*) [32])(auStack_180 + uVar87 * 0x18);
      auVar193._0_4_ = fVar185 + auVar114._0_4_;
      auVar193._4_4_ = fVar197 + auVar114._4_4_;
      auVar193._8_4_ = fVar199 + auVar114._8_4_;
      auVar193._12_4_ = fVar201 + auVar114._12_4_;
      auVar193._16_4_ = fVar184 + auVar114._16_4_;
      auVar193._20_4_ = fVar226 + auVar114._20_4_;
      auVar193._24_4_ = fVar204 + auVar114._24_4_;
      auVar193._28_4_ = fVar206 + auVar114._28_4_;
      uVar169 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
      auVar41._4_4_ = uVar169;
      auVar41._0_4_ = uVar169;
      auVar41._8_4_ = uVar169;
      auVar41._12_4_ = uVar169;
      auVar41._16_4_ = uVar169;
      auVar41._20_4_ = uVar169;
      auVar41._24_4_ = uVar169;
      auVar41._28_4_ = uVar169;
      uVar23 = vcmpps_avx512vl(auVar193,auVar41,2);
      uVar161 = (uint)uVar23 & (uint)abStack_1a0[uVar87 * 0x60];
    } while (uVar161 == 0);
    uVar95 = (&uStack_160)[uVar87 * 0xc];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar95;
    auVar224._8_4_ = 0x7f800000;
    auVar224._0_8_ = 0x7f8000007f800000;
    auVar224._12_4_ = 0x7f800000;
    auVar224._16_4_ = 0x7f800000;
    auVar224._20_4_ = 0x7f800000;
    auVar224._24_4_ = 0x7f800000;
    auVar224._28_4_ = 0x7f800000;
    auVar125 = vblendmps_avx512vl(auVar224,auVar114);
    bVar82 = (byte)uVar161;
    auVar158._0_4_ =
         (uint)(bVar82 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar82 & 1) * (int)auVar114._0_4_;
    bVar92 = (bool)((byte)(uVar161 >> 1) & 1);
    auVar158._4_4_ = (uint)bVar92 * auVar125._4_4_ | (uint)!bVar92 * (int)auVar114._4_4_;
    bVar92 = (bool)((byte)(uVar161 >> 2) & 1);
    auVar158._8_4_ = (uint)bVar92 * auVar125._8_4_ | (uint)!bVar92 * (int)auVar114._8_4_;
    bVar92 = (bool)((byte)(uVar161 >> 3) & 1);
    auVar158._12_4_ = (uint)bVar92 * auVar125._12_4_ | (uint)!bVar92 * (int)auVar114._12_4_;
    bVar92 = (bool)((byte)(uVar161 >> 4) & 1);
    auVar158._16_4_ = (uint)bVar92 * auVar125._16_4_ | (uint)!bVar92 * (int)auVar114._16_4_;
    bVar92 = (bool)((byte)(uVar161 >> 5) & 1);
    auVar158._20_4_ = (uint)bVar92 * auVar125._20_4_ | (uint)!bVar92 * (int)auVar114._20_4_;
    bVar92 = (bool)((byte)(uVar161 >> 6) & 1);
    auVar158._24_4_ = (uint)bVar92 * auVar125._24_4_ | (uint)!bVar92 * (int)auVar114._24_4_;
    auVar158._28_4_ =
         (uVar161 >> 7) * auVar125._28_4_ | (uint)!SUB41(uVar161 >> 7,0) * (int)auVar114._28_4_;
    auVar114 = vshufps_avx(auVar158,auVar158,0xb1);
    auVar114 = vminps_avx(auVar158,auVar114);
    auVar125 = vshufpd_avx(auVar114,auVar114,5);
    auVar114 = vminps_avx(auVar114,auVar125);
    auVar125 = vpermpd_avx2(auVar114,0x4e);
    auVar114 = vminps_avx(auVar114,auVar125);
    uVar23 = vcmpps_avx512vl(auVar158,auVar114,0);
    bVar90 = (byte)uVar23 & bVar82;
    if (bVar90 != 0) {
      uVar161 = (uint)bVar90;
    }
    uVar162 = 0;
    for (; (uVar161 & 1) == 0; uVar161 = uVar161 >> 1 | 0x80000000) {
      uVar162 = uVar162 + 1;
    }
    iVar91 = aiStack_158[uVar87 * 0x18];
    bVar82 = ~('\x01' << ((byte)uVar162 & 0x1f)) & bVar82;
    abStack_1a0[uVar87 * 0x60] = bVar82;
    if (bVar82 == 0) {
      uVar96 = uVar96 - 1;
    }
    uVar169 = (undefined4)uVar95;
    auVar176._4_4_ = uVar169;
    auVar176._0_4_ = uVar169;
    auVar176._8_4_ = uVar169;
    auVar176._12_4_ = uVar169;
    auVar176._16_4_ = uVar169;
    auVar176._20_4_ = uVar169;
    auVar176._24_4_ = uVar169;
    auVar176._28_4_ = uVar169;
    auVar97 = vmovshdup_avx(auVar110);
    auVar97 = vsubps_avx(auVar97,auVar110);
    auVar194._0_4_ = auVar97._0_4_;
    auVar194._4_4_ = auVar194._0_4_;
    auVar194._8_4_ = auVar194._0_4_;
    auVar194._12_4_ = auVar194._0_4_;
    auVar194._16_4_ = auVar194._0_4_;
    auVar194._20_4_ = auVar194._0_4_;
    auVar194._24_4_ = auVar194._0_4_;
    auVar194._28_4_ = auVar194._0_4_;
    auVar97 = vfmadd132ps_fma(auVar194,auVar176,_DAT_01f7b040);
    local_400._0_32_ = ZEXT1632(auVar97);
    local_670._8_8_ = 0;
    local_670._0_8_ = *(ulong *)(local_400 + (ulong)uVar162 * 4);
    uVar87 = (ulong)uVar96;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }